

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

bool embree::sse2::InstanceArrayIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float (*pafVar3) [16];
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  Geometry *pGVar8;
  long *plVar9;
  long lVar10;
  RTCPointQueryContext *pRVar11;
  undefined1 uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar26 [12];
  _func_int *p_Var19;
  float in_XMM0_Da;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float in_XMM0_Db;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float in_XMM0_Dc;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float in_XMM0_Dd;
  float extraout_XMM0_Dd;
  float fVar24;
  float fVar25;
  undefined1 auVar27 [12];
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar28 [16];
  float in_XMM2_Da;
  float fVar29;
  float fVar30;
  float in_XMM2_Db;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float in_XMM3_Da;
  float in_XMM3_Db;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  float in_XMM4_Da;
  float fVar31;
  float fVar32;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  float fVar33;
  undefined1 auVar34 [12];
  float fVar35;
  undefined1 in_XMM5 [16];
  float in_XMM6_Da;
  float fVar36;
  float fVar37;
  float in_XMM6_Db;
  float fVar40;
  float in_XMM6_Dc;
  float fVar41;
  float in_XMM6_Dd;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [12];
  float fVar42;
  float fVar43;
  float fVar48;
  uint uVar49;
  float fVar50;
  undefined1 in_XMM7 [16];
  vfloat4 l02;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float in_XMM10_Da;
  float in_XMM10_Db;
  float in_XMM10_Dc;
  float in_XMM10_Dd;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float in_XMM11_Da;
  float fVar64;
  float fVar65;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float fVar66;
  float fVar67;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  vfloat4 a0_1;
  undefined1 auVar68 [16];
  float in_XMM13_Da;
  float fVar69;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  float fVar70;
  undefined1 in_XMM14 [16];
  undefined1 auVar71 [16];
  float in_XMM15_Da;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  undefined8 local_198;
  float fStack_190;
  undefined8 local_e8;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  _func_int *local_a8;
  undefined8 local_a0;
  PointQuery *local_98;
  int local_90;
  PointQueryFunction local_88;
  RTCPointQueryContext *local_80;
  float local_78;
  void *local_70;
  undefined8 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  l02.field_0._0_12_ = in_XMM7._0_12_;
  a0.field_0._0_12_ = in_XMM1._0_12_;
  auVar34 = in_XMM5._0_12_;
  uVar17 = (ulong)prim->primID_;
  pGVar8 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var19 = *(_func_int **)&pGVar8->field_0x58;
  if (p_Var19 == (_func_int *)0x0) {
    uVar13 = (ulong)*(uint *)(*(long *)&pGVar8[1].time_range.upper +
                             (long)pGVar8[1].intersectionFilterN * uVar17);
    if (uVar13 == 0xffffffff) {
      p_Var19 = (_func_int *)0x0;
    }
    else {
      p_Var19 = pGVar8[1].super_RefCount._vptr_RefCount[uVar13];
    }
  }
  if (p_Var19 == (_func_int *)0x0) {
    return false;
  }
  if (pGVar8->numTimeSteps == 1) {
    plVar9 = *(long **)&pGVar8[1].fnumTimeSegments;
    iVar7 = (int)plVar9[4];
    if ((pGVar8->field_8).field_0x1 == '\x01') {
      fVar24 = in_XMM0_Da;
      fVar64 = in_XMM3_Da;
      fVar36 = in_XMM3_Db;
      fVar21 = in_XMM3_Dc;
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          in_XMM13_Db = *(float *)(lVar10 + 0x10 + lVar18);
          in_XMM13_Da = *(float *)(lVar10 + lVar18);
          in_XMM2_Da = *(float *)(lVar10 + 0xc + lVar18);
          in_XMM13_Dc = *(float *)(lVar10 + 0x20 + lVar18);
          in_XMM13_Dd = 0.0;
          in_XMM0_Db = *(float *)(lVar10 + 0x14 + lVar18);
          in_XMM0_Dc = *(float *)(lVar10 + 0x24 + lVar18);
          in_XMM0_Dd = 0.0;
          in_XMM3_Dd = 0.0;
          in_XMM2_Db = *(float *)(lVar10 + 0x1c + lVar18);
          in_XMM2_Dc = *(float *)(lVar10 + 0x2c + lVar18);
          in_XMM2_Dd = 0.0;
          fVar24 = *(float *)(lVar10 + 4 + lVar18);
          fVar64 = *(float *)(lVar10 + 8 + lVar18);
          fVar36 = *(float *)(lVar10 + 0x18 + lVar18);
          fVar21 = *(float *)(lVar10 + 0x28 + lVar18);
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar18);
          in_XMM13_Db = (float)uVar5;
          in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM13_Da = *(float *)(lVar10 + lVar18);
          in_XMM13_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
          in_XMM0_Db = (float)uVar5;
          in_XMM0_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM0_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
          in_XMM3_Dd = 0.0;
          uVar6 = *(undefined8 *)(lVar10 + 0x28 + lVar18);
          in_XMM2_Da = *(float *)(lVar10 + 0x24 + lVar18);
          in_XMM2_Db = (float)uVar6;
          in_XMM2_Dc = (float)((ulong)uVar6 >> 0x20);
          in_XMM2_Dd = 0.0;
          fVar24 = *(float *)(lVar10 + 0xc + lVar18);
          fVar64 = *(float *)(lVar10 + 0x18 + lVar18);
          fVar36 = (float)uVar5;
          fVar21 = (float)((ulong)uVar5 >> 0x20);
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
        fVar64 = (float)uVar5;
        fVar36 = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar18);
        in_XMM13_Da = *(float *)(lVar10 + lVar18);
        in_XMM0_Db = *(float *)(lVar10 + 4 + lVar18);
        fVar21 = *(float *)(lVar10 + 8 + lVar18);
        fVar24 = *(float *)(lVar10 + 0xc + lVar18);
        in_XMM13_Db = (float)uVar5;
        in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM2_Da = *(float *)(lVar10 + 0x18 + lVar18);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
        in_XMM2_Db = (float)uVar5;
        in_XMM2_Dc = (float)((ulong)uVar5 >> 0x20);
        auVar44._0_4_ = *(float *)(lVar10 + 0x24 + lVar18);
        fVar41 = *(float *)(lVar10 + 0x28 + lVar18);
        fVar69 = *(float *)(lVar10 + 0x2c + lVar18);
        fVar42 = *(float *)(lVar10 + 0x30 + lVar18);
        fVar48 = fVar42 * fVar42 + fVar69 * fVar69 + auVar44._0_4_ * auVar44._0_4_ + fVar41 * fVar41
        ;
        auVar39 = rsqrtss(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
        fVar43 = auVar39._0_4_;
        fVar43 = fVar43 * fVar43 * fVar48 * -0.5 * fVar43 + fVar43 * 1.5;
        in_XMM2_Dd = auVar44._0_4_ * fVar43;
        in_XMM13_Dd = fVar41 * fVar43;
        in_XMM0_Dd = fVar69 * fVar43;
        in_XMM3_Dd = fVar43 * fVar42;
        in_XMM0_Dc = *(float *)(lVar10 + 0x3c + lVar18);
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar18);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x10 + lVar18);
        fVar24 = *pfVar1;
        in_XMM0_Db = pfVar1[1];
        in_XMM0_Dc = pfVar1[2];
        in_XMM0_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x20 + lVar18);
        fVar64 = *pfVar1;
        fVar36 = pfVar1[1];
        fVar21 = pfVar1[2];
        in_XMM3_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x30 + lVar18);
        in_XMM2_Da = *pfVar1;
        in_XMM2_Db = pfVar1[1];
        in_XMM2_Dc = pfVar1[2];
        in_XMM2_Dd = pfVar1[3];
      }
      fVar43 = in_XMM13_Dd * in_XMM0_Dd + in_XMM3_Dd * in_XMM2_Dd;
      auVar44._0_4_ = in_XMM13_Dd * in_XMM0_Dd - in_XMM3_Dd * in_XMM2_Dd;
      fVar65 = in_XMM2_Dd * in_XMM2_Dd - in_XMM13_Dd * in_XMM13_Dd;
      fVar41 = in_XMM2_Dd * in_XMM2_Dd + in_XMM13_Dd * in_XMM13_Dd + -in_XMM0_Dd * in_XMM0_Dd +
               -in_XMM3_Dd * in_XMM3_Dd;
      fVar42 = in_XMM0_Dd * in_XMM0_Dd + fVar65 + -in_XMM3_Dd * in_XMM3_Dd;
      fVar57 = in_XMM13_Dd * in_XMM3_Dd - in_XMM0_Dd * in_XMM2_Dd;
      fVar69 = in_XMM0_Dd * in_XMM2_Dd + in_XMM13_Dd * in_XMM3_Dd;
      fVar48 = in_XMM0_Dd * in_XMM3_Dd + in_XMM13_Dd * in_XMM2_Dd;
      fVar51 = in_XMM0_Dd * in_XMM3_Dd - in_XMM13_Dd * in_XMM2_Dd;
      fVar43 = fVar43 + fVar43;
      fVar57 = fVar57 + fVar57;
      fVar65 = in_XMM3_Dd * in_XMM3_Dd + fVar65 + -in_XMM0_Dd * in_XMM0_Dd;
      in_XMM12_Da = fVar43 * 0.0 + fVar57 * 0.0;
      in_XMM12_Db = fVar43 * 1.0 + fVar57 * 0.0;
      in_XMM12_Dc = fVar43 * 0.0 + fVar57 * 1.0;
      in_XMM12_Dd = fVar43 * 0.0 + fVar57 * 0.0;
      in_XMM6_Da = fVar41 * 1.0 + in_XMM12_Da;
      in_XMM6_Db = fVar41 * 0.0 + in_XMM12_Db;
      in_XMM6_Dc = fVar41 * 0.0 + in_XMM12_Dc;
      in_XMM6_Dd = fVar41 * 0.0 + in_XMM12_Dd;
      fVar48 = fVar48 + fVar48;
      auVar44._0_4_ = auVar44._0_4_ + auVar44._0_4_;
      auVar34._0_4_ = auVar44._0_4_ * 1.0 + fVar42 * 0.0 + fVar48 * 0.0;
      auVar34._4_4_ = auVar44._0_4_ * 0.0 + fVar42 * 1.0 + fVar48 * 0.0;
      auVar34._8_4_ = auVar44._0_4_ * 0.0 + fVar42 * 0.0 + fVar48 * 1.0;
      fVar41 = auVar44._0_4_ * 0.0 + fVar42 * 0.0 + fVar48 * 0.0;
      fVar69 = fVar69 + fVar69;
      fVar51 = fVar51 + fVar51;
      fVar42 = fVar69 * 1.0 + fVar51 * 0.0 + fVar65 * 0.0;
      fVar43 = fVar69 * 0.0 + fVar51 * 1.0 + fVar65 * 0.0;
      fVar48 = fVar69 * 0.0 + fVar51 * 0.0 + fVar65 * 1.0;
      fVar69 = fVar69 * 0.0 + fVar51 * 0.0 + fVar65 * 0.0;
      fVar51 = in_XMM13_Db + 0.0;
      fVar65 = in_XMM0_Dc + 0.0;
      in_XMM3_Da = fVar21 * fVar42;
      in_XMM3_Db = fVar21 * fVar43;
      in_XMM3_Dc = fVar21 * fVar48;
      in_XMM3_Dd = fVar21 * fVar69;
      l02.field_0._0_4_ = fVar42 * 0.0;
      l02.field_0._4_4_ = fVar43 * 0.0;
      l02.field_0._8_4_ = fVar48 * 0.0;
      in_XMM4_Da = auVar34._0_4_ * 0.0 + l02.field_0._0_4_;
      in_XMM4_Db = auVar34._4_4_ * 0.0 + l02.field_0._4_4_;
      in_XMM4_Dc = auVar34._8_4_ * 0.0 + l02.field_0._8_4_;
      in_XMM4_Dd = fVar41 * 0.0 + fVar69 * 0.0;
      in_XMM11_Da = in_XMM13_Da * in_XMM6_Da + in_XMM4_Da;
      in_XMM11_Db = in_XMM13_Da * in_XMM6_Db + in_XMM4_Db;
      in_XMM11_Dc = in_XMM13_Da * in_XMM6_Dc + in_XMM4_Dc;
      in_XMM11_Dd = in_XMM13_Da * in_XMM6_Dd + in_XMM4_Dd;
      fVar21 = in_XMM0_Db * auVar34._8_4_;
      auVar44._0_4_ = in_XMM0_Db * fVar41;
      in_XMM0_Da = in_XMM0_Db * auVar34._0_4_ + l02.field_0._0_4_;
      in_XMM0_Db = in_XMM0_Db * auVar34._4_4_ + l02.field_0._4_4_;
      in_XMM0_Dc = fVar21 + l02.field_0._8_4_;
      in_XMM14._0_4_ = fVar24 * in_XMM6_Da + in_XMM0_Da;
      in_XMM14._4_4_ = fVar24 * in_XMM6_Db + in_XMM0_Db;
      in_XMM14._8_4_ = fVar24 * in_XMM6_Dc + in_XMM0_Dc;
      in_XMM14._12_4_ = fVar24 * in_XMM6_Dd + auVar44._0_4_ + fVar69 * 0.0;
      in_XMM13_Da = fVar64 * in_XMM6_Da + fVar36 * auVar34._0_4_ + in_XMM3_Da;
      in_XMM13_Db = fVar64 * in_XMM6_Db + fVar36 * auVar34._4_4_ + in_XMM3_Db;
      fVar21 = fVar64 * in_XMM6_Dc + fVar36 * auVar34._8_4_ + in_XMM3_Dc;
      in_XMM13_Dd = fVar64 * in_XMM6_Dd + fVar36 * fVar41 + in_XMM3_Dd;
      a0.field_0._0_4_ = in_XMM2_Db * auVar34._0_4_ + in_XMM2_Dc * fVar42;
      a0.field_0._4_4_ = in_XMM2_Db * auVar34._4_4_ + in_XMM2_Dc * fVar43;
      a0.field_0._8_4_ = in_XMM2_Db * auVar34._8_4_ + in_XMM2_Dc * fVar48;
      in_XMM15_Da = in_XMM2_Da * in_XMM6_Da + a0.field_0._0_4_ + fVar51;
      in_XMM15_Db = in_XMM2_Da * in_XMM6_Db + a0.field_0._4_4_ + in_XMM13_Dc + 0.0;
      in_XMM15_Dc = in_XMM2_Da * in_XMM6_Dc + a0.field_0._8_4_ + fVar65;
      in_XMM15_Dd = in_XMM2_Da * in_XMM6_Dd + in_XMM2_Db * fVar41 + in_XMM2_Dc * fVar69 + 0.0;
    }
    else {
      fVar21 = in_XMM13_Dc;
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          in_XMM11_Db = *(float *)(lVar10 + 0x10 + lVar18);
          in_XMM11_Da = *(float *)(lVar10 + lVar18);
          in_XMM13_Da = *(float *)(lVar10 + 8 + lVar18);
          in_XMM15_Da = *(float *)(lVar10 + 0xc + lVar18);
          in_XMM11_Dc = *(float *)(lVar10 + 0x20 + lVar18);
          in_XMM11_Dd = 0.0;
          in_XMM14._4_4_ = (float)*(undefined4 *)(lVar10 + 0x14 + lVar18);
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 4 + lVar18);
          in_XMM14._8_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar18);
          in_XMM14._12_4_ = 0.0;
          in_XMM13_Db = *(float *)(lVar10 + 0x18 + lVar18);
          in_XMM13_Dd = 0.0;
          in_XMM15_Db = *(float *)(lVar10 + 0x1c + lVar18);
          in_XMM0_Da = *(float *)(lVar10 + 0x2c + lVar18);
          in_XMM0_Db = 0.0;
          in_XMM0_Dc = 0.0;
          in_XMM15_Dd = 0.0;
          fVar21 = *(float *)(lVar10 + 0x28 + lVar18);
          in_XMM15_Dc = in_XMM0_Da;
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar18);
          in_XMM11_Db = (float)uVar5;
          in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM11_Da = *(float *)(lVar10 + lVar18);
          in_XMM11_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
          in_XMM14._4_4_ = (float)(int)uVar5;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar18);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
          in_XMM13_Db = (float)uVar5;
          in_XMM13_Da = *(float *)(lVar10 + 0x18 + lVar18);
          in_XMM13_Dd = 0.0;
          uVar6 = *(undefined8 *)(lVar10 + 0x28 + lVar18);
          in_XMM0_Da = (float)uVar6;
          in_XMM0_Db = (float)((ulong)uVar6 >> 0x20);
          in_XMM0_Dc = 0.0;
          in_XMM15_Da = *(float *)(lVar10 + 0x24 + lVar18);
          in_XMM15_Dd = 0.0;
          fVar21 = (float)((ulong)uVar5 >> 0x20);
          in_XMM15_Db = in_XMM0_Da;
          in_XMM15_Dc = in_XMM0_Db;
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
        in_XMM13_Da = (float)uVar5;
        in_XMM13_Db = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar18);
        in_XMM11_Db = (float)uVar5;
        in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM11_Da = *(float *)(lVar10 + lVar18);
        in_XMM3_Da = *(float *)(lVar10 + 8 + lVar18);
        in_XMM3_Db = 0.0;
        in_XMM3_Dc = 0.0;
        in_XMM3_Dd = 0.0;
        in_XMM14._4_4_ = (float)*(undefined4 *)(lVar10 + 4 + lVar18);
        in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar18);
        in_XMM15_Da = *(float *)(lVar10 + 0x18 + lVar18);
        uVar17 = *(ulong *)(lVar10 + 0x1c + lVar18);
        a0.field_0._8_4_ = 0.0;
        a0.field_0._0_8_ = uVar17;
        in_XMM15_Db = (float)uVar17;
        in_XMM15_Dc = (float)(uVar17 >> 0x20);
        fVar21 = *(float *)(lVar10 + 0x24 + lVar18);
        fVar24 = *(float *)(lVar10 + 0x28 + lVar18);
        fVar64 = *(float *)(lVar10 + 0x2c + lVar18);
        in_XMM4_Db = 0.0;
        in_XMM4_Dc = 0.0;
        in_XMM4_Dd = 0.0;
        in_XMM6_Da = *(float *)(lVar10 + 0x30 + lVar18);
        in_XMM6_Db = 0.0;
        in_XMM6_Dc = 0.0;
        in_XMM6_Dd = 0.0;
        auVar44._0_4_ =
             in_XMM6_Da * in_XMM6_Da + fVar64 * fVar64 + fVar21 * fVar21 + fVar24 * fVar24;
        auVar39 = rsqrtss(ZEXT416((uint)auVar44._0_4_),ZEXT416((uint)auVar44._0_4_));
        fVar36 = auVar39._0_4_;
        auVar45._4_12_ = auVar39._4_12_;
        fVar36 = fVar36 * fVar36 * auVar44._0_4_ * -0.5 * fVar36 + fVar36 * 1.5;
        in_XMM15_Dd = fVar21 * fVar36;
        auVar34._0_4_ = fVar24 * fVar36;
        in_XMM0_Db = fVar64 * fVar36;
        auVar45._0_4_ = fVar36 * in_XMM6_Da;
        l02.field_0._8_4_ = in_XMM3_Da;
        l02.field_0._0_8_ = auVar45._0_8_;
        auVar34._4_4_ = 0.0;
        auVar34._8_4_ = in_XMM11_Dc;
        in_XMM0_Da = *(float *)(lVar10 + 0x3c + lVar18);
        in_XMM0_Dc = 0.0;
        in_XMM14._12_4_ = in_XMM0_Db;
        in_XMM14._8_4_ = in_XMM0_Da;
        in_XMM4_Da = in_XMM0_Db;
        in_XMM11_Dd = auVar34._0_4_;
        fVar21 = in_XMM3_Da;
        in_XMM13_Dd = auVar45._0_4_;
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar18);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
        in_XMM14 = *(undefined1 (*) [16])(lVar10 + 0x10 + lVar18);
        pfVar1 = (float *)(lVar10 + 0x20 + lVar18);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dd = pfVar1[3];
        pfVar2 = (float *)(lVar10 + 0x30 + lVar18);
        in_XMM15_Da = *pfVar2;
        in_XMM15_Db = pfVar2[1];
        in_XMM15_Dc = pfVar2[2];
        in_XMM15_Dd = pfVar2[3];
        fVar21 = pfVar1[2];
      }
    }
  }
  else {
    fVar21 = pGVar8->fnumTimeSegments;
    fVar36 = 0.0;
    auVar44._0_4_ = 0.0;
    fVar42 = 0.0;
    fVar64 = (pGVar8->time_range).lower;
    fVar41 = 0.0;
    fVar69 = 0.0;
    fVar43 = 0.0;
    fVar57 = ((query->time - fVar64) / ((pGVar8->time_range).upper - fVar64)) * fVar21;
    fVar24 = fVar21;
    in_XMM0_Da = floorf(fVar57);
    fStack_234 = 0.0;
    fVar48 = 0.0;
    fStack_230 = 0.0;
    fVar51 = 0.0;
    fStack_22c = 0.0;
    fVar65 = 0.0;
    if (fVar21 + -1.0 <= in_XMM0_Da) {
      in_XMM0_Da = fVar21 + -1.0;
    }
    auVar26 = ZEXT812(0);
    if (0.0 <= in_XMM0_Da) {
      auVar26._4_8_ = 0;
      auVar26._0_4_ = in_XMM0_Da;
    }
    auVar39._12_4_ = 0;
    auVar39._0_12_ = auVar26;
    uVar14 = (uint)auVar26._0_4_;
    fVar57 = fVar57 - auVar26._0_4_;
    lVar10 = *(long *)&pGVar8[1].fnumTimeSegments;
    plVar9 = (long *)(lVar10 + (ulong)uVar14 * 0x38);
    iVar7 = *(int *)(lVar10 + 0x20 + (ulong)uVar14 * 0x38);
    if ((pGVar8->field_8).field_0x1 == '\x01') {
      fVar21 = fVar57;
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar18 = *plVar9;
          lVar15 = plVar9[2] * uVar17;
          in_XMM10_Db = *(float *)(lVar18 + 0x10 + lVar15);
          in_XMM10_Da = *(float *)(lVar18 + lVar15);
          in_XMM11_Da = *(float *)(lVar18 + 4 + lVar15);
          fVar21 = *(float *)(lVar18 + 8 + lVar15);
          in_XMM10_Dc = *(float *)(lVar18 + 0x20 + lVar15);
          in_XMM11_Db = *(float *)(lVar18 + 0x14 + lVar15);
          in_XMM11_Dc = *(float *)(lVar18 + 0x24 + lVar15);
          fVar48 = *(float *)(lVar18 + 0x18 + lVar15);
          fVar51 = *(float *)(lVar18 + 0x28 + lVar15);
          auVar27._4_4_ = *(undefined4 *)(lVar18 + 0x1c + lVar15);
          auVar27._0_4_ = *(undefined4 *)(lVar18 + 0xc + lVar15);
          auVar27._8_4_ = *(undefined4 *)(lVar18 + 0x2c + lVar15);
        }
        else {
          fVar48 = fStack_234;
          fVar51 = fStack_230;
          fVar65 = fStack_22c;
          if (iVar7 != 0x9234) goto LAB_00ae2bb0;
          lVar18 = *plVar9;
          lVar15 = plVar9[2] * uVar17;
          uVar5 = *(undefined8 *)(lVar18 + 4 + lVar15);
          in_XMM10_Db = (float)uVar5;
          in_XMM10_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM10_Da = *(float *)(lVar18 + lVar15);
          uVar5 = *(undefined8 *)(lVar18 + 0x10 + lVar15);
          in_XMM11_Db = (float)uVar5;
          in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM11_Da = *(float *)(lVar18 + 0xc + lVar15);
          uVar5 = *(undefined8 *)(lVar18 + 0x1c + lVar15);
          fVar48 = (float)uVar5;
          fVar51 = (float)((ulong)uVar5 >> 0x20);
          fVar21 = *(float *)(lVar18 + 0x18 + lVar15);
          uVar5 = *(undefined8 *)(lVar18 + 0x28 + lVar15);
          auVar27._4_4_ = (int)uVar5;
          auVar27._0_4_ = *(undefined4 *)(lVar18 + 0x24 + lVar15);
          auVar27._8_4_ = (int)((ulong)uVar5 >> 0x20);
        }
        fVar65 = 0.0;
        in_XMM10_Dd = 0.0;
        auVar39._12_4_ = 0;
        auVar39._0_12_ = auVar27;
        in_XMM11_Dd = 0.0;
        _local_218 = auVar39;
      }
      else if (iVar7 == 0xb001) {
        lVar18 = *plVar9;
        lVar15 = plVar9[2] * uVar17;
        pfVar1 = (float *)(lVar18 + 0x10 + lVar15);
        fVar21 = *pfVar1;
        fVar48 = pfVar1[1];
        uVar5 = *(undefined8 *)(lVar18 + 0x34 + lVar15);
        in_XMM10_Db = (float)uVar5;
        in_XMM10_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM10_Da = *(float *)(lVar18 + lVar15);
        in_XMM11_Db = *(float *)(lVar18 + 4 + lVar15);
        fVar51 = *(float *)(lVar18 + 8 + lVar15);
        in_XMM11_Da = *(float *)(lVar18 + 0xc + lVar15);
        in_XMM13_Da = *(float *)(lVar18 + 0x18 + lVar15);
        uVar13 = *(ulong *)(lVar18 + 0x1c + lVar15);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar13;
        in_XMM13_Db = (float)uVar13;
        in_XMM13_Dc = (float)(uVar13 >> 0x20);
        fVar24 = *(float *)(lVar18 + 0x24 + lVar15);
        in_XMM10_Dd = *(float *)(lVar18 + 0x28 + lVar15);
        fVar64 = *(float *)(lVar18 + 0x2c + lVar15);
        fVar36 = *(float *)(lVar18 + 0x30 + lVar15);
        fVar41 = fVar36 * fVar36 + fVar64 * fVar64 + fVar24 * fVar24 + in_XMM10_Dd * in_XMM10_Dd;
        auVar47 = rsqrtss(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
        auVar44._0_4_ = auVar47._0_4_;
        fVar65 = auVar44._0_4_ * auVar44._0_4_ * fVar41 * -0.5 * auVar44._0_4_ + auVar44._0_4_ * 1.5
        ;
        in_XMM13_Dd = fVar24 * fVar65;
        in_XMM10_Dd = in_XMM10_Dd * fVar65;
        in_XMM11_Dd = fVar64 * fVar65;
        fVar65 = fVar65 * fVar36;
        in_XMM11_Dc = *(float *)(lVar18 + 0x3c + lVar15);
        local_218._4_4_ = in_XMM13_Db;
        local_218._0_4_ = in_XMM13_Da;
        fStack_210 = in_XMM13_Dc;
        fStack_20c = in_XMM13_Dd;
      }
      else if (iVar7 == 0x9244) {
        lVar18 = *plVar9;
        lVar15 = plVar9[2] * uVar17;
        pfVar1 = (float *)(lVar18 + lVar15);
        in_XMM10_Da = *pfVar1;
        in_XMM10_Db = pfVar1[1];
        in_XMM10_Dc = pfVar1[2];
        in_XMM10_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar18 + 0x10 + lVar15);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar18 + 0x20 + lVar15);
        fVar21 = *pfVar1;
        fVar48 = pfVar1[1];
        fVar51 = pfVar1[2];
        fVar65 = pfVar1[3];
        _local_218 = *(undefined1 (*) [16])(lVar18 + 0x30 + lVar15);
      }
LAB_00ae2bb0:
      lVar18 = (ulong)(uVar14 + 1) * 0x38;
      plVar9 = (long *)(lVar10 + lVar18);
      iVar7 = *(int *)(lVar10 + 0x20 + lVar18);
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          in_XMM13_Db = *(float *)(lVar10 + 0x10 + lVar18);
          in_XMM13_Da = *(float *)(lVar10 + lVar18);
          in_XMM15_Da = *(float *)(lVar10 + 4 + lVar18);
          in_XMM13_Dc = *(float *)(lVar10 + 0x20 + lVar18);
          in_XMM13_Dd = 0.0;
          in_XMM15_Db = *(float *)(lVar10 + 0x14 + lVar18);
          in_XMM15_Dc = *(float *)(lVar10 + 0x24 + lVar18);
          in_XMM15_Dd = 0.0;
          in_XMM14._4_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar18);
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar18);
          in_XMM14._8_4_ = (float)*(undefined4 *)(lVar10 + 0x28 + lVar18);
          in_XMM14._12_4_ = 0.0;
          auVar39._4_4_ = *(undefined4 *)(lVar10 + 0x1c + lVar18);
          auVar39._0_4_ = *(undefined4 *)(lVar10 + 0xc + lVar18);
          auVar39._8_4_ = *(undefined4 *)(lVar10 + 0x2c + lVar18);
          auVar39._12_4_ = 0;
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar18);
          in_XMM13_Db = (float)uVar5;
          in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM13_Da = *(float *)(lVar10 + lVar18);
          in_XMM13_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
          in_XMM15_Db = (float)uVar5;
          in_XMM15_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM15_Da = *(float *)(lVar10 + 0xc + lVar18);
          in_XMM15_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
          in_XMM14._4_4_ = (float)(int)uVar5;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar18);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x28 + lVar18);
          auVar39._4_4_ = (int)uVar5;
          auVar39._0_4_ = *(undefined4 *)(lVar10 + 0x24 + lVar18);
          auVar39._8_4_ = (int)((ulong)uVar5 >> 0x20);
          auVar39._12_4_ = 0;
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar18);
        in_XMM13_Db = (float)uVar5;
        in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM13_Da = *(float *)(lVar10 + lVar18);
        in_XMM15_Db = *(float *)(lVar10 + 4 + lVar18);
        in_XMM15_Da = *(float *)(lVar10 + 0xc + lVar18);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
        fVar24 = *(float *)(lVar10 + 0x24 + lVar18);
        fVar64 = *(float *)(lVar10 + 0x28 + lVar18);
        fVar36 = *(float *)(lVar10 + 0x2c + lVar18);
        auVar44._0_4_ = *(float *)(lVar10 + 0x30 + lVar18);
        fVar69 = auVar44._0_4_ * auVar44._0_4_ + fVar36 * fVar36 + fVar24 * fVar24 + fVar64 * fVar64
        ;
        auVar39 = rsqrtss(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
        fVar41 = auVar39._0_4_;
        fVar41 = fVar41 * fVar41 * fVar69 * -0.5 * fVar41 + fVar41 * 1.5;
        in_XMM13_Dd = fVar64 * fVar41;
        in_XMM15_Dd = fVar36 * fVar41;
        in_XMM14._8_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar18);
        in_XMM14._0_8_ = *(undefined8 *)(lVar10 + 0x10 + lVar18);
        in_XMM14._12_4_ = fVar41 * auVar44._0_4_;
        in_XMM15_Dc = *(float *)(lVar10 + 0x3c + lVar18);
        auVar39._4_4_ = (int)uVar5;
        auVar39._0_4_ = *(undefined4 *)(lVar10 + 0x18 + lVar18);
        auVar39._8_4_ = (int)((ulong)uVar5 >> 0x20);
        auVar39._12_4_ = fVar24 * fVar41;
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar18);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x10 + lVar18);
        in_XMM15_Da = *pfVar1;
        in_XMM15_Db = pfVar1[1];
        in_XMM15_Dc = pfVar1[2];
        in_XMM15_Dd = pfVar1[3];
        in_XMM14 = *(undefined1 (*) [16])(lVar10 + 0x20 + lVar18);
        auVar39 = *(undefined1 (*) [16])(lVar10 + 0x30 + lVar18);
      }
      fVar24 = auVar39._12_4_;
      auVar44._0_4_ = in_XMM14._12_4_;
      local_1e8 = CONCAT44(in_XMM11_Dd,in_XMM11_Dd);
      uStack_1e0 = CONCAT44(in_XMM11_Dd,in_XMM11_Dd);
      fVar36 = fVar65 * auVar44._0_4_ +
               in_XMM11_Dd * in_XMM15_Dd + fVar24 * fStack_20c + in_XMM10_Dd * in_XMM13_Dd;
      fVar64 = -fVar36;
      if (fVar36 < fVar64) {
        in_XMM15_Dd = -in_XMM15_Dd;
      }
      fVar69 = ABS(fVar36);
      fVar41 = fVar64;
      if (fVar64 <= fVar36) {
        fVar41 = fVar36;
      }
      fVar42 = 1.0 - fVar69;
      if (fVar42 < 0.0) {
        fVar42 = sqrtf(fVar42);
      }
      else {
        fVar42 = SQRT(fVar42);
      }
      fVar43 = 1.5707964 -
               fVar42 * (((((fVar69 * -0.0043095737 + 0.0192803) * fVar69 + -0.04489909) * fVar69 +
                          0.08785567) * fVar69 + -0.21450998) * fVar69 + 1.5707952);
      fVar42 = 0.0;
      if (0.0 <= fVar43) {
        fVar42 = fVar43;
      }
      fVar56 = (float)(-(uint)(1.0 < fVar69) & 0x7fc00000 |
                      ~-(uint)(1.0 < fVar69) &
                      (uint)(1.5707964 -
                            (float)((uint)-fVar42 & -(uint)(fVar41 < 0.0) |
                                   ~-(uint)(fVar41 < 0.0) & (uint)fVar42))) * fVar57;
      fVar43 = floorf(fVar56 * 0.63661975);
      fVar56 = fVar56 - fVar43 * 1.5707964;
      fVar42 = fVar56 * fVar56;
      uVar14 = (int)fVar43 & 3;
      fVar69 = ((((fVar42 * -2.5963018e-07 + 2.4756235e-05) * fVar42 + -0.001388833) * fVar42 +
                0.04166664) * fVar42 + -0.5) * fVar42 + 1.0;
      fVar56 = (((((fVar42 * -2.5029328e-08 + 2.7600126e-06) * fVar42 + -0.00019842605) * fVar42 +
                 0.008333348) * fVar42 + -0.16666667) * fVar42 + 1.0) * fVar56;
      fVar42 = fVar56;
      if (((int)fVar43 & 1U) != 0) {
        fVar42 = fVar69;
        fVar69 = fVar56;
      }
      fVar64 = (float)(~-(uint)(fVar36 < fVar64) & (uint)auVar44._0_4_ |
                      (uint)-auVar44._0_4_ & -(uint)(fVar36 < fVar64));
      if (1 < uVar14) {
        fVar42 = -fVar42;
      }
      if (uVar14 - 1 < 2) {
        fVar69 = -fVar69;
      }
      fVar70 = fVar41 * in_XMM11_Dd - in_XMM15_Dd;
      fVar56 = fVar41 * fVar65 - fVar64;
      auVar44._0_4_ = 1.0 - fVar57;
      fVar43 = auVar44._0_4_ * in_XMM11_Dd + in_XMM15_Dd * fVar57;
      fVar64 = auVar44._0_4_ * fVar65 + fVar64 * fVar57;
      uVar14 = (int)((uint)(fVar36 < 0.0) << 0x1f) >> 0x1f;
      uVar49 = (int)((uint)(fVar36 < 0.0) << 0x1f) >> 0x1f;
      fVar60 = (float)((uint)-fVar24 & uVar14 | ~uVar14 & (uint)fVar24);
      fVar29 = (float)((uint)-in_XMM13_Dd & uVar49 | ~uVar49 & (uint)in_XMM13_Dd);
      fVar24 = fVar41 * fStack_20c - fVar60;
      fVar36 = fVar41 * in_XMM10_Dd - fVar29;
      auVar54._0_8_ = CONCAT44(fVar65,fVar56) ^ 0x8000000000000000;
      auVar54._8_4_ = -fVar65;
      auVar54._12_4_ = -fVar65;
      auVar61._4_12_ = auVar54._4_12_;
      auVar61._0_4_ = fVar56 * fVar56 + fVar70 * fVar70 + fVar24 * fVar24 + fVar36 * fVar36;
      auVar47._0_8_ = CONCAT44(fVar65,auVar61._0_4_) ^ 0x8000000000000000;
      auVar47._8_4_ = -fVar65;
      auVar47._12_4_ = -fVar65;
      auVar47 = rsqrtss(auVar47,auVar61);
      fVar59 = auVar47._0_4_;
      fVar25 = fVar59 * fVar59 * auVar61._0_4_ * -0.5 * fVar59 + fVar59 * 1.5;
      fVar59 = fStack_20c * auVar44._0_4_ + fVar60 * fVar57;
      fVar60 = in_XMM10_Dd * auVar44._0_4_ + fVar29 * fVar57;
      fVar31 = fVar64 * fVar64 + fVar43 * fVar43 + fVar59 * fVar59 + fVar60 * fVar60;
      auVar47 = rsqrtss(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
      fVar29 = auVar47._0_4_;
      fVar29 = fVar29 * fVar29 * fVar31 * -0.5 * fVar29 + fVar29 * 1.5;
      uVar14 = (int)((uint)(0.9995 < fVar41) << 0x1f) >> 0x1f;
      uVar49 = (int)((uint)(0.9995 < fVar41) << 0x1f) >> 0x1f;
      fVar24 = (float)(~uVar14 & (uint)(fVar69 * fStack_20c - fVar42 * fVar25 * fVar24) |
                      (uint)(fVar29 * fVar59) & uVar14);
      fVar36 = (float)(~uVar49 & (uint)(fVar69 * in_XMM10_Dd - fVar42 * fVar25 * fVar36) |
                      (uint)(fVar29 * fVar60) & uVar49);
      if (0.9995 < fVar41) {
        fVar43 = fVar43 * fVar29;
        fVar64 = fVar64 * fVar29;
      }
      else {
        fVar43 = in_XMM11_Dd * fVar69 - fVar70 * fVar25 * fVar42;
        fVar64 = fVar65 * fVar69 - fVar56 * fVar25 * fVar42;
      }
      fVar42 = in_XMM13_Db * fVar57;
      fVar41 = in_XMM10_Da * auVar44._0_4_ + in_XMM13_Da * fVar57;
      fVar56 = in_XMM11_Dc * auVar44._0_4_;
      fVar69 = in_XMM11_Da * auVar44._0_4_ + in_XMM15_Da * fVar57;
      fVar65 = in_XMM11_Db * auVar44._0_4_ + in_XMM15_Db * fVar57;
      local_1b8 = in_XMM14._0_4_;
      fStack_1b4 = in_XMM14._4_4_;
      fStack_1b0 = in_XMM14._8_4_;
      fVar59 = fVar21 * auVar44._0_4_ + local_1b8 * fVar57;
      fVar48 = fVar48 * auVar44._0_4_ + fStack_1b4 * fVar57;
      fVar51 = fVar51 * auVar44._0_4_ + fStack_1b0 * fVar57;
      local_1c8 = auVar39._0_4_;
      fStack_1c4 = auVar39._4_4_;
      fStack_1c0 = auVar39._8_4_;
      fVar25 = (float)local_218._0_4_ * auVar44._0_4_ + local_1c8 * fVar57;
      fVar31 = (float)local_218._4_4_ * auVar44._0_4_ + fStack_1c4 * fVar57;
      fVar70 = fStack_210 * auVar44._0_4_ + fStack_1c0 * fVar57;
      fVar20 = fVar36 * fVar43 + fVar24 * fVar64;
      fVar29 = fVar36 * fVar43 - fVar24 * fVar64;
      fVar60 = fVar24 * fVar24 + fVar36 * fVar36 + -fVar43 * fVar43 + -fVar64 * fVar64;
      fVar52 = fVar24 * fVar24 - fVar36 * fVar36;
      fVar37 = fVar43 * fVar43 + fVar52 + -fVar64 * fVar64;
      fVar35 = fVar36 * fVar64 - fVar24 * fVar43;
      fVar33 = fVar24 * fVar43 + fVar36 * fVar64;
      fVar40 = fVar43 * fVar64 + fVar24 * fVar36;
      fVar21 = fVar43 * fVar64 - fVar24 * fVar36;
      fVar20 = fVar20 + fVar20;
      fVar35 = fVar35 + fVar35;
      fVar52 = fVar64 * fVar64 + fVar52 + -fVar43 * fVar43;
      in_XMM12_Da = 0.0;
      in_XMM12_Db = 0.0;
      in_XMM12_Dc = 1.0;
      in_XMM12_Dd = 0.0;
      in_XMM4_Da = fVar60 * 1.0 + fVar20 * 0.0 + fVar35 * 0.0;
      in_XMM4_Db = fVar60 * 0.0 + fVar20 * 1.0 + fVar35 * 0.0;
      in_XMM4_Dc = fVar60 * 0.0 + fVar20 * 0.0 + fVar35 * 1.0;
      in_XMM4_Dd = fVar60 * 0.0 + fVar20 * 0.0 + fVar35 * 0.0;
      fVar40 = fVar40 + fVar40;
      fVar29 = fVar29 + fVar29;
      auVar34._0_4_ = fVar29 * 1.0 + fVar37 * 0.0 + fVar40 * 0.0;
      auVar34._4_4_ = fVar29 * 0.0 + fVar37 * 1.0 + fVar40 * 0.0;
      auVar34._8_4_ = fVar29 * 0.0 + fVar37 * 0.0 + fVar40 * 1.0;
      fVar24 = fVar29 * 0.0 + fVar37 * 0.0 + fVar40 * 0.0;
      fVar33 = fVar33 + fVar33;
      fVar21 = fVar21 + fVar21;
      fVar64 = fVar33 * 1.0 + fVar21 * 0.0 + fVar52 * 0.0;
      fVar36 = fVar33 * 0.0 + fVar21 * 1.0 + fVar52 * 0.0;
      fVar43 = fVar33 * 0.0 + fVar21 * 0.0 + fVar52 * 1.0;
      fVar60 = fVar33 * 0.0 + fVar21 * 0.0 + fVar52 * 0.0;
      in_XMM3_Da = fVar51 * fVar64;
      in_XMM3_Db = fVar51 * fVar36;
      in_XMM3_Dc = fVar51 * fVar43;
      in_XMM3_Dd = fVar51 * fVar60;
      l02.field_0._0_4_ = fVar70 * fVar64;
      l02.field_0._4_4_ = fVar70 * fVar36;
      l02.field_0._8_4_ = fVar70 * fVar43;
      in_XMM6_Da = fVar64 * 0.0;
      in_XMM6_Db = fVar36 * 0.0;
      in_XMM6_Dc = fVar43 * 0.0;
      in_XMM6_Dd = fVar60 * 0.0;
      in_XMM11_Da = fVar41 * in_XMM4_Da + auVar34._0_4_ * 0.0 + in_XMM6_Da;
      in_XMM11_Db = fVar41 * in_XMM4_Db + auVar34._4_4_ * 0.0 + in_XMM6_Db;
      in_XMM11_Dc = fVar41 * in_XMM4_Dc + auVar34._8_4_ * 0.0 + in_XMM6_Dc;
      in_XMM11_Dd = fVar41 * in_XMM4_Dd + fVar24 * 0.0 + in_XMM6_Dd;
      in_XMM14._0_4_ = fVar69 * in_XMM4_Da + fVar65 * auVar34._0_4_ + in_XMM6_Da;
      in_XMM14._4_4_ = fVar69 * in_XMM4_Db + fVar65 * auVar34._4_4_ + in_XMM6_Db;
      in_XMM14._8_4_ = fVar69 * in_XMM4_Dc + fVar65 * auVar34._8_4_ + in_XMM6_Dc;
      in_XMM14._12_4_ = fVar69 * in_XMM4_Dd + fVar65 * fVar24 + in_XMM6_Dd;
      in_XMM0_Da = fVar48 * auVar34._0_4_ + in_XMM3_Da;
      in_XMM0_Db = fVar48 * auVar34._4_4_ + in_XMM3_Db;
      in_XMM0_Dc = fVar48 * auVar34._8_4_ + in_XMM3_Dc;
      in_XMM13_Da = fVar59 * in_XMM4_Da + in_XMM0_Da;
      in_XMM13_Db = fVar59 * in_XMM4_Db + in_XMM0_Db;
      fVar21 = fVar59 * in_XMM4_Dc + in_XMM0_Dc;
      in_XMM13_Dd = fVar59 * in_XMM4_Dd + fVar48 * fVar24 + in_XMM3_Dd;
      a0.field_0._0_4_ = fVar31 * auVar34._0_4_ + l02.field_0._0_4_;
      a0.field_0._4_4_ = fVar31 * auVar34._4_4_ + l02.field_0._4_4_;
      a0.field_0._8_4_ = fVar31 * auVar34._8_4_ + l02.field_0._8_4_;
      in_XMM15_Da = fVar25 * in_XMM4_Da + a0.field_0._0_4_ +
                    in_XMM10_Db * auVar44._0_4_ + fVar42 + 0.0;
      in_XMM15_Db = fVar25 * in_XMM4_Db + a0.field_0._4_4_ +
                    in_XMM10_Dc * auVar44._0_4_ + in_XMM13_Dc * fVar57 + 0.0;
      in_XMM15_Dc = fVar25 * in_XMM4_Dc + a0.field_0._8_4_ + fVar56 + in_XMM15_Dc * fVar57 + 0.0;
      in_XMM15_Dd = fVar25 * in_XMM4_Dd + fVar31 * fVar24 + fVar70 * fVar60 + 0.0;
    }
    else {
      in_XMM0_Db = extraout_XMM0_Db;
      in_XMM0_Dc = extraout_XMM0_Dc;
      fVar48 = extraout_XMM0_Dd;
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar18 = *plVar9;
          lVar15 = plVar9[2] * uVar17;
          in_XMM11_Db = *(float *)(lVar18 + 0x10 + lVar15);
          in_XMM11_Da = *(float *)(lVar18 + lVar15);
          in_XMM13_Da = *(float *)(lVar18 + 8 + lVar15);
          in_XMM0_Da = *(float *)(lVar18 + 0xc + lVar15);
          in_XMM11_Dc = *(float *)(lVar18 + 0x20 + lVar15);
          in_XMM11_Dd = 0.0;
          in_XMM14._4_4_ = (float)*(undefined4 *)(lVar18 + 0x14 + lVar15);
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar18 + 4 + lVar15);
          in_XMM14._8_4_ = (float)*(undefined4 *)(lVar18 + 0x24 + lVar15);
          in_XMM14._12_4_ = 0.0;
          in_XMM13_Db = *(float *)(lVar18 + 0x18 + lVar15);
          in_XMM13_Dd = 0.0;
          in_XMM0_Db = *(float *)(lVar18 + 0x1c + lVar15);
          in_XMM0_Dc = *(float *)(lVar18 + 0x2c + lVar15);
          auVar39 = ZEXT416((uint)in_XMM0_Dc);
          fVar48 = 0.0;
          in_XMM13_Dc = *(float *)(lVar18 + 0x28 + lVar15);
        }
        else if (iVar7 == 0x9234) {
          lVar18 = *plVar9;
          lVar15 = plVar9[2] * uVar17;
          uVar5 = *(undefined8 *)(lVar18 + 4 + lVar15);
          in_XMM11_Db = (float)uVar5;
          in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM11_Da = *(float *)(lVar18 + lVar15);
          in_XMM11_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar18 + 0x10 + lVar15);
          in_XMM14._4_4_ = (float)(int)uVar5;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar18 + 0xc + lVar15);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar5 = *(undefined8 *)(lVar18 + 0x1c + lVar15);
          in_XMM13_Db = (float)uVar5;
          in_XMM13_Da = *(float *)(lVar18 + 0x18 + lVar15);
          in_XMM13_Dd = 0.0;
          uVar13 = *(ulong *)(lVar18 + 0x28 + lVar15);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar13;
          in_XMM0_Da = *(float *)(lVar18 + 0x24 + lVar15);
          in_XMM0_Db = (float)uVar13;
          in_XMM0_Dc = (float)(uVar13 >> 0x20);
          fVar48 = 0.0;
          in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
        }
      }
      else if (iVar7 == 0xb001) {
        lVar18 = *plVar9;
        lVar15 = plVar9[2] * uVar17;
        uVar5 = *(undefined8 *)(lVar18 + 0x10 + lVar15);
        in_XMM13_Da = (float)uVar5;
        in_XMM13_Db = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar18 + 0x34 + lVar15);
        in_XMM11_Da = *(float *)(lVar18 + lVar15);
        in_XMM4_Da = *(float *)(lVar18 + 8 + lVar15);
        in_XMM4_Db = 0.0;
        in_XMM4_Dc = 0.0;
        in_XMM4_Dd = 0.0;
        in_XMM14._4_4_ = (float)*(undefined4 *)(lVar18 + 4 + lVar15);
        in_XMM14._0_4_ = (float)*(undefined4 *)(lVar18 + 0xc + lVar15);
        in_XMM11_Db = (float)uVar5;
        in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM0_Da = *(float *)(lVar18 + 0x18 + lVar15);
        pfVar1 = (float *)(lVar18 + 0x1c + lVar15);
        in_XMM0_Db = *pfVar1;
        in_XMM0_Dc = pfVar1[1];
        auVar44._0_4_ = 0.0;
        fVar42 = 0.0;
        fVar48 = *(float *)(lVar18 + 0x24 + lVar15);
        fVar21 = *(float *)(lVar18 + 0x28 + lVar15);
        fVar24 = *(float *)(lVar18 + 0x2c + lVar15);
        fVar64 = *(float *)(lVar18 + 0x30 + lVar15);
        l02.field_0._4_8_ = 0;
        l02.field_0._0_4_ = fVar64;
        fVar41 = fVar64 * fVar64 + fVar24 * fVar24 + fVar48 * fVar48 + fVar21 * fVar21;
        auVar39 = rsqrtss(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
        fVar36 = auVar39._0_4_;
        fVar36 = fVar36 * fVar36 * fVar41 * -0.5 * fVar36 + fVar36 * 1.5;
        fVar48 = fVar48 * fVar36;
        in_XMM11_Dd = fVar21 * fVar36;
        auVar34._0_4_ = fVar24 * fVar36;
        auVar34._4_8_ = 0;
        in_XMM13_Dd = fVar36 * fVar64;
        in_XMM6_Db = 0.0;
        in_XMM6_Dd = 0.0;
        auVar39._0_8_ = CONCAT44(auVar34._0_4_,*(undefined4 *)(lVar18 + 0x3c + lVar15));
        auVar39._8_8_ = 0;
        in_XMM14._8_8_ = auVar39._0_8_;
        fVar41 = 0.0;
        fVar43 = 0.0;
        fVar64 = fVar48;
        fVar69 = in_XMM0_Dc;
        in_XMM13_Dc = in_XMM4_Da;
        fVar24 = in_XMM0_Db;
        fVar36 = in_XMM0_Dc;
        in_XMM6_Da = in_XMM11_Dd;
        in_XMM6_Dc = in_XMM11_Dc;
      }
      else if (iVar7 == 0x9244) {
        lVar18 = *plVar9;
        lVar15 = plVar9[2] * uVar17;
        pfVar1 = (float *)(lVar18 + lVar15);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
        in_XMM14 = *(undefined1 (*) [16])(lVar18 + 0x10 + lVar15);
        pfVar1 = (float *)(lVar18 + 0x20 + lVar15);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dd = pfVar1[3];
        pfVar2 = (float *)(lVar18 + 0x30 + lVar15);
        in_XMM0_Da = *pfVar2;
        in_XMM0_Db = pfVar2[1];
        in_XMM0_Dc = pfVar2[2];
        fVar48 = pfVar2[3];
        in_XMM13_Dc = pfVar1[2];
      }
      lVar18 = (ulong)(uVar14 + 1) * 0x38;
      plVar9 = (long *)(lVar10 + lVar18);
      iVar7 = *(int *)(lVar10 + 0x20 + lVar18);
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          fVar36 = *(float *)(lVar10 + 0x10 + lVar18);
          fVar24 = *(float *)(lVar10 + lVar18);
          fVar64 = *(float *)(lVar10 + 4 + lVar18);
          in_XMM4_Da = *(float *)(lVar10 + 0xc + lVar18);
          auVar44._0_4_ = *(float *)(lVar10 + 0x20 + lVar18);
          fVar42 = 0.0;
          fVar41 = *(float *)(lVar10 + 0x14 + lVar18);
          fVar69 = *(float *)(lVar10 + 0x24 + lVar18);
          fVar43 = 0.0;
          auVar39._4_4_ = *(undefined4 *)(lVar10 + 0x18 + lVar18);
          auVar39._0_4_ = *(undefined4 *)(lVar10 + 8 + lVar18);
          auVar39._8_4_ = *(undefined4 *)(lVar10 + 0x28 + lVar18);
          auVar39._12_4_ = 0;
          in_XMM4_Db = *(float *)(lVar10 + 0x1c + lVar18);
          in_XMM4_Dc = *(float *)(lVar10 + 0x2c + lVar18);
          auVar34._4_8_ = 0;
          auVar34._0_4_ = in_XMM4_Dc;
          in_XMM4_Dd = 0.0;
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar18);
          fVar24 = *(float *)(lVar10 + lVar18);
          fVar36 = (float)uVar5;
          auVar44._0_4_ = (float)((ulong)uVar5 >> 0x20);
          fVar42 = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
          fVar64 = *(float *)(lVar10 + 0xc + lVar18);
          fVar41 = (float)uVar5;
          fVar69 = (float)((ulong)uVar5 >> 0x20);
          fVar43 = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
          auVar39._4_4_ = (int)uVar5;
          auVar39._0_4_ = *(undefined4 *)(lVar10 + 0x18 + lVar18);
          auVar39._8_4_ = (int)((ulong)uVar5 >> 0x20);
          auVar39._12_4_ = 0;
          uVar17 = *(ulong *)(lVar10 + 0x28 + lVar18);
          auVar34._8_4_ = 0.0;
          auVar34._0_8_ = uVar17;
          in_XMM4_Da = *(float *)(lVar10 + 0x24 + lVar18);
          in_XMM4_Db = (float)uVar17;
          in_XMM4_Dc = (float)(uVar17 >> 0x20);
          in_XMM4_Dd = 0.0;
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar18);
        fVar24 = *(float *)(lVar10 + lVar18);
        fVar41 = *(float *)(lVar10 + 4 + lVar18);
        fVar64 = *(float *)(lVar10 + 0xc + lVar18);
        in_XMM4_Da = *(float *)(lVar10 + 0x18 + lVar18);
        pfVar1 = (float *)(lVar10 + 0x1c + lVar18);
        in_XMM4_Db = *pfVar1;
        in_XMM4_Dc = pfVar1[1];
        in_XMM6_Dc = 0.0;
        in_XMM6_Dd = 0.0;
        fVar21 = *(float *)(lVar10 + 0x24 + lVar18);
        fVar42 = *(float *)(lVar10 + 0x28 + lVar18);
        fVar43 = *(float *)(lVar10 + 0x2c + lVar18);
        fVar36 = *(float *)(lVar10 + 0x30 + lVar18);
        fVar69 = fVar36 * fVar36 + fVar43 * fVar43 + fVar21 * fVar21 + fVar42 * fVar42;
        auVar39 = rsqrtss(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
        auVar44._0_4_ = auVar39._0_4_;
        auVar44._0_4_ =
             auVar44._0_4_ * auVar44._0_4_ * fVar69 * -0.5 * auVar44._0_4_ + auVar44._0_4_ * 1.5;
        l02.field_0._0_4_ = fVar21 * auVar44._0_4_;
        fVar42 = fVar42 * auVar44._0_4_;
        fVar43 = fVar43 * auVar44._0_4_;
        auVar39._8_4_ = *(undefined4 *)(lVar10 + 8 + lVar18);
        auVar39._0_8_ = *(undefined8 *)(lVar10 + 0x10 + lVar18);
        auVar39._12_4_ = auVar44._0_4_ * fVar36;
        auVar44._0_4_ = (float)((ulong)uVar5 >> 0x20);
        fVar36 = (float)uVar5;
        fVar69 = *(float *)(lVar10 + 0x3c + lVar18);
        auVar34._4_4_ = fVar43;
        auVar34._0_4_ = fVar69;
        auVar34._8_4_ = 0.0;
        l02.field_0._4_4_ = 0.0;
        l02.field_0._8_4_ = in_XMM4_Dc;
        in_XMM4_Dd = l02.field_0._0_4_;
        in_XMM6_Da = in_XMM4_Db;
        in_XMM6_Db = in_XMM4_Dc;
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar18);
        fVar24 = *pfVar1;
        fVar36 = pfVar1[1];
        auVar44._0_4_ = pfVar1[2];
        fVar42 = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x10 + lVar18);
        fVar64 = *pfVar1;
        fVar41 = pfVar1[1];
        fVar69 = pfVar1[2];
        fVar43 = pfVar1[3];
        auVar39 = *(undefined1 (*) [16])(lVar10 + 0x20 + lVar18);
        pfVar1 = (float *)(lVar10 + 0x30 + lVar18);
        in_XMM4_Da = *pfVar1;
        in_XMM4_Db = pfVar1[1];
        in_XMM4_Dc = pfVar1[2];
        in_XMM4_Dd = pfVar1[3];
      }
      fVar51 = 1.0 - fVar57;
      in_XMM11_Da = in_XMM11_Da * fVar51 + fVar24 * fVar57;
      in_XMM11_Db = in_XMM11_Db * fVar51 + fVar36 * fVar57;
      in_XMM11_Dc = in_XMM11_Dc * fVar51 + auVar44._0_4_ * fVar57;
      in_XMM11_Dd = in_XMM11_Dd * fVar51 + fVar42 * fVar57;
      in_XMM3_Da = fVar64 * fVar57;
      in_XMM3_Db = fVar41 * fVar57;
      in_XMM3_Dc = fVar69 * fVar57;
      in_XMM3_Dd = fVar43 * fVar57;
      fVar21 = in_XMM14._4_4_;
      fVar24 = in_XMM14._8_4_;
      fVar64 = in_XMM14._12_4_;
      in_XMM14._0_4_ = in_XMM14._0_4_ * fVar51 + in_XMM3_Da;
      in_XMM14._4_4_ = fVar21 * fVar51 + in_XMM3_Db;
      in_XMM14._8_4_ = fVar24 * fVar51 + in_XMM3_Dc;
      in_XMM14._12_4_ = fVar64 * fVar51 + in_XMM3_Dd;
      a0.field_0._0_4_ = auVar39._0_4_ * fVar57;
      a0.field_0._4_4_ = auVar39._4_4_ * fVar57;
      a0.field_0._8_4_ = auVar39._8_4_ * fVar57;
      in_XMM13_Da = in_XMM13_Da * fVar51 + a0.field_0._0_4_;
      in_XMM13_Db = in_XMM13_Db * fVar51 + a0.field_0._4_4_;
      fVar21 = in_XMM13_Dc * fVar51 + a0.field_0._8_4_;
      in_XMM13_Dd = in_XMM13_Dd * fVar51 + auVar39._12_4_ * fVar57;
      in_XMM12_Da = fVar57 * in_XMM4_Da;
      in_XMM12_Db = fVar57 * in_XMM4_Db;
      in_XMM12_Dc = fVar57 * in_XMM4_Dc;
      in_XMM12_Dd = fVar57 * in_XMM4_Dd;
      in_XMM15_Da = fVar51 * in_XMM0_Da + in_XMM12_Da;
      in_XMM15_Db = fVar51 * in_XMM0_Db + in_XMM12_Db;
      in_XMM15_Dc = fVar51 * in_XMM0_Dc + in_XMM12_Dc;
      in_XMM15_Dd = fVar51 * fVar48 + in_XMM12_Dd;
    }
  }
  uVar17 = (ulong)prim->primID_;
  if (pGVar8->numTimeSteps == 1) {
    plVar9 = *(long **)&pGVar8[1].fnumTimeSegments;
    iVar7 = (int)plVar9[4];
    if ((pGVar8->field_8).field_0x1 == '\x01') {
      fVar24 = in_XMM11_Da;
      fVar36 = in_XMM11_Db;
      auVar44._0_4_ = in_XMM11_Dc;
      fVar64 = in_XMM11_Dd;
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          in_XMM3_Da = *(float *)(lVar10 + 4 + lVar18);
          in_XMM6_Da = *(float *)(lVar10 + 8 + lVar18);
          in_XMM4_Da = *(float *)(lVar10 + 0xc + lVar18);
          in_XMM3_Db = *(float *)(lVar10 + 0x14 + lVar18);
          in_XMM3_Dc = *(float *)(lVar10 + 0x24 + lVar18);
          in_XMM3_Dd = 0.0;
          in_XMM6_Db = *(float *)(lVar10 + 0x18 + lVar18);
          in_XMM6_Dc = *(float *)(lVar10 + 0x28 + lVar18);
          in_XMM6_Dd = 0.0;
          in_XMM4_Db = *(float *)(lVar10 + 0x1c + lVar18);
          in_XMM4_Dc = *(float *)(lVar10 + 0x2c + lVar18);
          in_XMM4_Dd = 0.0;
          fVar24 = *(float *)(lVar10 + lVar18);
          fVar36 = *(float *)(lVar10 + 0x10 + lVar18);
          auVar44._0_4_ = *(float *)(lVar10 + 0x20 + lVar18);
          fVar64 = 0.0;
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar18 = uVar17 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar18);
          uVar6 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
          in_XMM3_Db = (float)uVar6;
          in_XMM3_Dc = (float)((ulong)uVar6 >> 0x20);
          in_XMM3_Da = *(float *)(lVar10 + 0xc + lVar18);
          in_XMM3_Dd = 0.0;
          uVar6 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
          in_XMM6_Db = (float)uVar6;
          in_XMM6_Dc = (float)((ulong)uVar6 >> 0x20);
          in_XMM6_Da = *(float *)(lVar10 + 0x18 + lVar18);
          in_XMM6_Dd = 0.0;
          uVar6 = *(undefined8 *)(lVar10 + 0x28 + lVar18);
          in_XMM4_Db = (float)uVar6;
          in_XMM4_Dc = (float)((ulong)uVar6 >> 0x20);
          in_XMM4_Da = *(float *)(lVar10 + 0x24 + lVar18);
          in_XMM4_Dd = 0.0;
          fVar24 = *(float *)(lVar10 + lVar18);
          fVar36 = (float)uVar5;
          auVar44._0_4_ = (float)((ulong)uVar5 >> 0x20);
          fVar64 = 0.0;
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        pfVar1 = (float *)(lVar10 + 0x10 + lVar18);
        in_XMM6_Da = *pfVar1;
        in_XMM6_Db = pfVar1[1];
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar18);
        fVar36 = (float)uVar5;
        auVar44._0_4_ = (float)((ulong)uVar5 >> 0x20);
        fVar24 = *(float *)(lVar10 + lVar18);
        in_XMM3_Db = *(float *)(lVar10 + 4 + lVar18);
        in_XMM6_Dc = *(float *)(lVar10 + 8 + lVar18);
        in_XMM3_Da = *(float *)(lVar10 + 0xc + lVar18);
        in_XMM4_Da = *(float *)(lVar10 + 0x18 + lVar18);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
        in_XMM4_Db = (float)uVar5;
        in_XMM4_Dc = (float)((ulong)uVar5 >> 0x20);
        fVar41 = *(float *)(lVar10 + 0x24 + lVar18);
        fVar64 = *(float *)(lVar10 + 0x28 + lVar18);
        fVar69 = *(float *)(lVar10 + 0x2c + lVar18);
        fVar42 = *(float *)(lVar10 + 0x30 + lVar18);
        fVar48 = fVar42 * fVar42 + fVar69 * fVar69 + fVar41 * fVar41 + fVar64 * fVar64;
        auVar39 = rsqrtss(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
        fVar43 = auVar39._0_4_;
        fVar43 = fVar43 * fVar43 * fVar48 * -0.5 * fVar43 + fVar43 * 1.5;
        in_XMM4_Dd = fVar41 * fVar43;
        fVar64 = fVar64 * fVar43;
        in_XMM3_Dd = fVar69 * fVar43;
        in_XMM6_Dd = fVar43 * fVar42;
        in_XMM3_Dc = *(float *)(lVar10 + 0x3c + lVar18);
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar18);
        fVar24 = *pfVar1;
        fVar36 = pfVar1[1];
        auVar44._0_4_ = pfVar1[2];
        fVar64 = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x10 + lVar18);
        in_XMM3_Da = *pfVar1;
        in_XMM3_Db = pfVar1[1];
        in_XMM3_Dc = pfVar1[2];
        in_XMM3_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x20 + lVar18);
        in_XMM6_Da = *pfVar1;
        in_XMM6_Db = pfVar1[1];
        in_XMM6_Dc = pfVar1[2];
        in_XMM6_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x30 + lVar18);
        in_XMM4_Da = *pfVar1;
        in_XMM4_Db = pfVar1[1];
        in_XMM4_Dc = pfVar1[2];
        in_XMM4_Dd = pfVar1[3];
      }
      fVar65 = fVar64 * in_XMM3_Dd + in_XMM4_Dd * in_XMM6_Dd;
      fVar51 = fVar64 * in_XMM3_Dd - in_XMM4_Dd * in_XMM6_Dd;
      fVar42 = in_XMM4_Dd * in_XMM4_Dd + fVar64 * fVar64 + -in_XMM3_Dd * in_XMM3_Dd +
               -in_XMM6_Dd * in_XMM6_Dd;
      fVar69 = in_XMM4_Dd * in_XMM4_Dd - fVar64 * fVar64;
      fVar56 = in_XMM3_Dd * in_XMM3_Dd + fVar69 + -in_XMM6_Dd * in_XMM6_Dd;
      fVar41 = fVar64 * in_XMM6_Dd - in_XMM4_Dd * in_XMM3_Dd;
      fVar57 = in_XMM4_Dd * in_XMM3_Dd + fVar64 * in_XMM6_Dd;
      fVar59 = in_XMM3_Dd * in_XMM6_Dd + fVar64 * in_XMM4_Dd;
      fVar64 = in_XMM3_Dd * in_XMM6_Dd - fVar64 * in_XMM4_Dd;
      fVar65 = fVar65 + fVar65;
      fVar41 = fVar41 + fVar41;
      fVar69 = in_XMM6_Dd * in_XMM6_Dd + fVar69 + -in_XMM3_Dd * in_XMM3_Dd;
      fVar43 = fVar42 * 1.0 + fVar65 * 0.0 + fVar41 * 0.0;
      fVar48 = fVar42 * 0.0 + fVar65 * 1.0 + fVar41 * 0.0;
      fVar41 = fVar42 * 0.0 + fVar65 * 0.0 + fVar41 * 1.0;
      fVar59 = fVar59 + fVar59;
      fVar51 = fVar51 + fVar51;
      fVar42 = fVar51 * 1.0 + fVar56 * 0.0 + fVar59 * 0.0;
      fVar65 = fVar51 * 0.0 + fVar56 * 1.0 + fVar59 * 0.0;
      fVar51 = fVar51 * 0.0 + fVar56 * 0.0 + fVar59 * 1.0;
      fVar57 = fVar57 + fVar57;
      fVar64 = fVar64 + fVar64;
      fVar56 = fVar57 * 1.0 + fVar64 * 0.0 + fVar69 * 0.0;
      fVar59 = fVar57 * 0.0 + fVar64 * 1.0 + fVar69 * 0.0;
      fVar64 = fVar57 * 0.0 + fVar64 * 0.0 + fVar69 * 1.0;
      in_XMM12_Da = fVar24 * fVar43 + fVar42 * 0.0 + fVar56 * 0.0;
      in_XMM12_Db = fVar24 * fVar48 + fVar65 * 0.0 + fVar59 * 0.0;
      in_XMM12_Dc = fVar24 * fVar41 + fVar51 * 0.0 + fVar64 * 0.0;
      a0.field_0._0_4_ = in_XMM3_Da * fVar43 + in_XMM3_Db * fVar42 + fVar56 * 0.0;
      a0.field_0._4_4_ = in_XMM3_Da * fVar48 + in_XMM3_Db * fVar65 + fVar59 * 0.0;
      a0.field_0._8_4_ = in_XMM3_Da * fVar41 + in_XMM3_Db * fVar51 + fVar64 * 0.0;
      in_XMM0_Da = in_XMM6_Da * fVar43 + in_XMM6_Db * fVar42 + in_XMM6_Dc * fVar56;
      in_XMM0_Db = in_XMM6_Da * fVar48 + in_XMM6_Db * fVar65 + in_XMM6_Dc * fVar59;
      in_XMM0_Dc = in_XMM6_Da * fVar41 + in_XMM6_Db * fVar51 + in_XMM6_Dc * fVar64;
      auVar34._0_4_ = in_XMM4_Da * fVar43 + in_XMM4_Db * fVar42 + in_XMM4_Dc * fVar56 + fVar36 + 0.0
      ;
      auVar34._4_4_ =
           in_XMM4_Da * fVar48 + in_XMM4_Db * fVar65 + in_XMM4_Dc * fVar59 + auVar44._0_4_ + 0.0;
      auVar34._8_4_ =
           in_XMM4_Da * fVar41 + in_XMM4_Db * fVar51 + in_XMM4_Dc * fVar64 + in_XMM3_Dc + 0.0;
    }
    else if (iVar7 < 0x9244) {
      if (iVar7 == 0x9134) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        in_XMM12_Db = *(float *)(lVar10 + 0x10 + lVar18);
        in_XMM12_Da = *(float *)(lVar10 + lVar18);
        in_XMM0_Da = *(float *)(lVar10 + 8 + lVar18);
        in_XMM12_Dc = *(float *)(lVar10 + 0x20 + lVar18);
        a0.field_0._4_4_ = (float)*(undefined4 *)(lVar10 + 0x14 + lVar18);
        a0.field_0._0_4_ = (float)*(undefined4 *)(lVar10 + 4 + lVar18);
        a0.field_0._8_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar18);
        in_XMM0_Db = *(float *)(lVar10 + 0x18 + lVar18);
        in_XMM0_Dc = *(float *)(lVar10 + 0x28 + lVar18);
        auVar34._4_4_ = (float)*(undefined4 *)(lVar10 + 0x1c + lVar18);
        auVar34._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar18);
        auVar34._8_4_ = (float)*(undefined4 *)(lVar10 + 0x2c + lVar18);
      }
      else if (iVar7 == 0x9234) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 4 + lVar18);
        in_XMM12_Db = (float)uVar5;
        in_XMM12_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM12_Da = *(float *)(lVar10 + lVar18);
        uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
        a0.field_0._4_4_ = (float)(int)uVar5;
        a0.field_0._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar18);
        a0.field_0._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
        in_XMM0_Da = *(float *)(lVar10 + 0x18 + lVar18);
        in_XMM0_Db = (float)uVar5;
        in_XMM0_Dc = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x28 + lVar18);
        auVar34._4_4_ = (float)(int)uVar5;
        auVar34._0_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar18);
        auVar34._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
      }
    }
    else if (iVar7 == 0xb001) {
      lVar10 = *plVar9;
      lVar18 = uVar17 * plVar9[2];
      uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
      in_XMM0_Da = (float)uVar5;
      in_XMM0_Db = (float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar18);
      in_XMM12_Da = *(float *)(lVar10 + lVar18);
      in_XMM0_Dc = *(float *)(lVar10 + 8 + lVar18);
      auVar28._4_4_ = *(undefined4 *)(lVar10 + 4 + lVar18);
      auVar28._0_4_ = *(undefined4 *)(lVar10 + 0xc + lVar18);
      uVar6 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
      fVar24 = *(float *)(lVar10 + 0x24 + lVar18);
      fVar64 = *(float *)(lVar10 + 0x28 + lVar18);
      fVar36 = *(float *)(lVar10 + 0x2c + lVar18);
      auVar44._0_4_ = *(float *)(lVar10 + 0x30 + lVar18);
      fVar64 = auVar44._0_4_ * auVar44._0_4_ + fVar36 * fVar36 + fVar24 * fVar24 + fVar64 * fVar64;
      auVar39 = rsqrtss(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
      fVar24 = auVar39._0_4_;
      in_XMM12_Db = (float)uVar5;
      in_XMM12_Dc = (float)((ulong)uVar5 >> 0x20);
      auVar28._12_4_ = fVar36 * (fVar24 * fVar24 * fVar64 * -0.5 * fVar24 + fVar24 * 1.5);
      auVar28._8_4_ = *(undefined4 *)(lVar10 + 0x3c + lVar18);
      a0.field_0._0_12_ = auVar28._0_12_;
      auVar34._4_4_ = (float)(int)uVar6;
      auVar34._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar18);
      auVar34._8_4_ = (float)(int)((ulong)uVar6 >> 0x20);
    }
    else if (iVar7 == 0x9244) {
      lVar10 = *plVar9;
      lVar18 = uVar17 * plVar9[2];
      pfVar1 = (float *)(lVar10 + lVar18);
      in_XMM12_Da = *pfVar1;
      in_XMM12_Db = pfVar1[1];
      in_XMM12_Dc = pfVar1[2];
      a0.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x10 + lVar18),0);
      pfVar1 = (float *)(lVar10 + 0x20 + lVar18);
      in_XMM0_Da = *pfVar1;
      in_XMM0_Db = pfVar1[1];
      in_XMM0_Dc = pfVar1[2];
      auVar34 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x30 + lVar18),0);
    }
    goto LAB_00ae1e0d;
  }
  fVar24 = pGVar8->fnumTimeSegments;
  fVar36 = (pGVar8->time_range).lower;
  auVar44._0_4_ = 0.0;
  fVar41 = 0.0;
  fVar20 = ((query->time - fVar36) / ((pGVar8->time_range).upper - fVar36)) * fVar24;
  fVar69 = in_XMM11_Da;
  fVar48 = in_XMM11_Db;
  fVar51 = in_XMM11_Dc;
  fVar33 = in_XMM11_Dd;
  fVar56 = in_XMM13_Da;
  fVar25 = in_XMM13_Db;
  fVar29 = fVar21;
  fVar70 = in_XMM13_Dd;
  auVar71 = in_XMM14;
  fVar57 = in_XMM15_Da;
  fVar59 = in_XMM15_Db;
  fVar60 = in_XMM15_Dc;
  fVar31 = in_XMM15_Dd;
  fVar64 = floorf(fVar20);
  fStack_234 = 0.0;
  fVar42 = 0.0;
  fStack_230 = 0.0;
  fVar43 = 0.0;
  fStack_22c = 0.0;
  fVar65 = 0.0;
  fVar24 = fVar24 + -1.0;
  if (fVar24 <= fVar64) {
    fVar64 = fVar24;
  }
  fVar24 = 0.0;
  if (0.0 <= fVar64) {
    fVar24 = fVar64;
  }
  fVar40 = 0.0;
  fVar37 = 0.0;
  fVar52 = 0.0;
  uVar14 = (uint)fVar24;
  fVar20 = fVar20 - fVar24;
  lVar10 = *(long *)&pGVar8[1].fnumTimeSegments;
  plVar9 = (long *)(lVar10 + (ulong)uVar14 * 0x38);
  iVar7 = *(int *)(lVar10 + 0x20 + (ulong)uVar14 * 0x38);
  if ((pGVar8->field_8).field_0x1 != '\x01') {
    fVar69 = extraout_XMM0_Db_00;
    fVar42 = extraout_XMM0_Dc_00;
    local_1e8._4_4_ = in_XMM4_Dc;
    if (iVar7 < 0x9244) {
      if (iVar7 == 0x9134) {
        lVar18 = *plVar9;
        lVar15 = plVar9[2] * uVar17;
        in_XMM12_Db = *(float *)(lVar18 + 0x10 + lVar15);
        in_XMM12_Da = *(float *)(lVar18 + lVar15);
        fVar24 = *(float *)(lVar18 + 4 + lVar15);
        fVar64 = *(float *)(lVar18 + 8 + lVar15);
        fVar56 = *(float *)(lVar18 + 0xc + lVar15);
        in_XMM12_Dc = *(float *)(lVar18 + 0x20 + lVar15);
        fVar37 = *(float *)(lVar18 + 0x14 + lVar15);
        fVar69 = *(float *)(lVar18 + 0x18 + lVar15);
        fVar42 = *(float *)(lVar18 + 0x28 + lVar15);
        fVar36 = *(float *)(lVar18 + 0x2c + lVar15);
        auVar44._0_4_ = 0.0;
        fVar41 = 0.0;
        fVar25 = *(float *)(lVar18 + 0x1c + lVar15);
        fVar29 = fVar36;
        fVar40 = *(float *)(lVar18 + 0x24 + lVar15);
      }
      else if (iVar7 == 0x9234) {
        lVar18 = *plVar9;
        lVar15 = plVar9[2] * uVar17;
        uVar5 = *(undefined8 *)(lVar18 + 4 + lVar15);
        in_XMM12_Db = (float)uVar5;
        in_XMM12_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM12_Da = *(float *)(lVar18 + lVar15);
        uVar5 = *(undefined8 *)(lVar18 + 0x10 + lVar15);
        fVar37 = (float)uVar5;
        fVar24 = *(float *)(lVar18 + 0xc + lVar15);
        uVar6 = *(undefined8 *)(lVar18 + 0x1c + lVar15);
        fVar64 = *(float *)(lVar18 + 0x18 + lVar15);
        fVar69 = (float)uVar6;
        fVar42 = (float)((ulong)uVar6 >> 0x20);
        uVar6 = *(undefined8 *)(lVar18 + 0x28 + lVar15);
        fVar36 = (float)uVar6;
        auVar44._0_4_ = (float)((ulong)uVar6 >> 0x20);
        fVar41 = 0.0;
        fVar56 = *(float *)(lVar18 + 0x24 + lVar15);
        fVar25 = fVar36;
        fVar29 = auVar44._0_4_;
        fVar40 = (float)((ulong)uVar5 >> 0x20);
      }
    }
    else if (iVar7 == 0xb001) {
      lVar18 = *plVar9;
      lVar15 = plVar9[2] * uVar17;
      uVar5 = *(undefined8 *)(lVar18 + 0x10 + lVar15);
      fVar64 = (float)uVar5;
      fVar69 = (float)((ulong)uVar5 >> 0x20);
      pfVar1 = (float *)(lVar18 + 0x34 + lVar15);
      in_XMM12_Db = *pfVar1;
      in_XMM12_Dc = pfVar1[1];
      in_XMM6_Dc = 0.0;
      in_XMM12_Da = *(float *)(lVar18 + lVar15);
      fVar37 = *(float *)(lVar18 + 4 + lVar15);
      fVar42 = *(float *)(lVar18 + 8 + lVar15);
      fVar24 = *(float *)(lVar18 + 0xc + lVar15);
      fVar56 = *(float *)(lVar18 + 0x18 + lVar15);
      uVar5 = *(undefined8 *)(lVar18 + 0x1c + lVar15);
      in_XMM4_Da = (float)uVar5;
      in_XMM4_Db = (float)((ulong)uVar5 >> 0x20);
      local_1e8._4_4_ = 0.0;
      fVar36 = *(float *)(lVar18 + 0x24 + lVar15);
      auVar44._0_4_ = *(float *)(lVar18 + 0x28 + lVar15);
      fVar41 = *(float *)(lVar18 + 0x2c + lVar15);
      fVar43 = *(float *)(lVar18 + 0x30 + lVar15);
      auVar44._0_4_ =
           fVar43 * fVar43 + fVar41 * fVar41 + fVar36 * fVar36 + auVar44._0_4_ * auVar44._0_4_;
      auVar39 = rsqrtss(ZEXT416((uint)auVar44._0_4_),ZEXT416((uint)auVar44._0_4_));
      fVar36 = auVar39._0_4_;
      auVar44._0_4_ = fVar41 * (fVar36 * fVar36 * auVar44._0_4_ * -0.5 * fVar36 + fVar36 * 1.5);
      auVar44._4_8_ = 0;
      fVar36 = *(float *)(lVar18 + 0x3c + lVar15);
      fVar41 = 0.0;
      fVar25 = in_XMM4_Da;
      fVar29 = in_XMM4_Db;
      l02.field_0._0_12_ = auVar44;
      fVar40 = fVar36;
      in_XMM6_Da = in_XMM12_Db;
      in_XMM6_Db = in_XMM12_Dc;
    }
    else if (iVar7 == 0x9244) {
      lVar18 = *plVar9;
      lVar15 = plVar9[2] * uVar17;
      pfVar1 = (float *)(lVar18 + lVar15);
      in_XMM12_Da = *pfVar1;
      in_XMM12_Db = pfVar1[1];
      in_XMM12_Dc = pfVar1[2];
      pfVar1 = (float *)(lVar18 + 0x10 + lVar15);
      fVar24 = *pfVar1;
      fVar37 = pfVar1[1];
      pfVar2 = (float *)(lVar18 + 0x20 + lVar15);
      fVar64 = *pfVar2;
      fVar69 = pfVar2[1];
      fVar42 = pfVar2[2];
      pfVar2 = (float *)(lVar18 + 0x30 + lVar15);
      fVar56 = *pfVar2;
      fVar29 = pfVar2[2];
      fVar25 = pfVar2[1];
      fVar40 = pfVar1[2];
    }
    lVar18 = (ulong)(uVar14 + 1) * 0x38;
    plVar9 = (long *)(lVar10 + lVar18);
    iVar7 = *(int *)(lVar10 + 0x20 + lVar18);
    if (iVar7 < 0x9244) {
      if (iVar7 == 0x9134) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        in_XMM4_Db = *(float *)(lVar10 + 0x10 + lVar18);
        in_XMM4_Da = *(float *)(lVar10 + lVar18);
        in_XMM6_Da = *(float *)(lVar10 + 4 + lVar18);
        fVar36 = *(float *)(lVar10 + 8 + lVar18);
        local_1e8._4_4_ = *(float *)(lVar10 + 0x20 + lVar18);
        in_XMM6_Db = *(float *)(lVar10 + 0x14 + lVar18);
        in_XMM6_Dc = *(float *)(lVar10 + 0x24 + lVar18);
        auVar44._0_4_ = *(float *)(lVar10 + 0x18 + lVar18);
        fVar41 = *(float *)(lVar10 + 0x28 + lVar18);
        l02.field_0._4_4_ = (float)*(undefined4 *)(lVar10 + 0x1c + lVar18);
        l02.field_0._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar18);
        l02.field_0._8_4_ = (float)*(undefined4 *)(lVar10 + 0x2c + lVar18);
      }
      else if (iVar7 == 0x9234) {
        lVar10 = *plVar9;
        lVar18 = uVar17 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 4 + lVar18);
        in_XMM4_Da = *(float *)(lVar10 + lVar18);
        in_XMM4_Db = (float)uVar5;
        local_1e8._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
        in_XMM6_Da = *(float *)(lVar10 + 0xc + lVar18);
        in_XMM6_Db = (float)uVar5;
        in_XMM6_Dc = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
        fVar36 = *(float *)(lVar10 + 0x18 + lVar18);
        auVar44._0_4_ = (float)uVar5;
        fVar41 = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x28 + lVar18);
        l02.field_0._4_4_ = (float)(int)uVar5;
        l02.field_0._0_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar18);
        l02.field_0._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
      }
    }
    else if (iVar7 == 0xb001) {
      lVar10 = *plVar9;
      lVar18 = uVar17 * plVar9[2];
      uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
      fVar36 = (float)uVar5;
      auVar44._0_4_ = (float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar18);
      in_XMM4_Da = *(float *)(lVar10 + lVar18);
      in_XMM6_Db = *(float *)(lVar10 + 4 + lVar18);
      fVar41 = *(float *)(lVar10 + 8 + lVar18);
      in_XMM6_Da = *(float *)(lVar10 + 0xc + lVar18);
      in_XMM4_Db = (float)uVar5;
      uVar6 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
      fVar43 = *(float *)(lVar10 + 0x24 + lVar18);
      fVar48 = *(float *)(lVar10 + 0x28 + lVar18);
      fVar51 = *(float *)(lVar10 + 0x2c + lVar18);
      fVar65 = *(float *)(lVar10 + 0x30 + lVar18);
      fVar43 = fVar65 * fVar65 + fVar51 * fVar51 + fVar43 * fVar43 + fVar48 * fVar48;
      rsqrtss(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
      local_1e8._4_4_ = (float)((ulong)uVar5 >> 0x20);
      in_XMM6_Dc = *(float *)(lVar10 + 0x3c + lVar18);
      l02.field_0._4_4_ = (float)(int)uVar6;
      l02.field_0._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar18);
      l02.field_0._8_4_ = (float)(int)((ulong)uVar6 >> 0x20);
    }
    else if (iVar7 == 0x9244) {
      lVar10 = *plVar9;
      lVar18 = uVar17 * plVar9[2];
      pfVar1 = (float *)(lVar10 + lVar18);
      in_XMM4_Da = *pfVar1;
      in_XMM4_Db = pfVar1[1];
      local_1e8._4_4_ = pfVar1[2];
      pfVar1 = (float *)(lVar10 + 0x10 + lVar18);
      in_XMM6_Da = *pfVar1;
      in_XMM6_Db = pfVar1[1];
      in_XMM6_Dc = pfVar1[2];
      pfVar1 = (float *)(lVar10 + 0x20 + lVar18);
      fVar36 = *pfVar1;
      auVar44._0_4_ = pfVar1[1];
      fVar41 = pfVar1[2];
      l02.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x30 + lVar18),0);
    }
    fVar43 = 1.0 - fVar20;
    in_XMM12_Da = in_XMM12_Da * fVar43 + in_XMM4_Da * fVar20;
    in_XMM12_Db = in_XMM12_Db * fVar43 + in_XMM4_Db * fVar20;
    in_XMM12_Dc = in_XMM12_Dc * fVar43 + local_1e8._4_4_ * fVar20;
    a0.field_0._0_4_ = fVar24 * fVar43 + in_XMM6_Da * fVar20;
    a0.field_0._4_4_ = fVar37 * fVar43 + in_XMM6_Db * fVar20;
    a0.field_0._8_4_ = fVar40 * fVar43 + in_XMM6_Dc * fVar20;
    in_XMM0_Da = fVar64 * fVar43 + fVar36 * fVar20;
    in_XMM0_Db = fVar69 * fVar43 + auVar44._0_4_ * fVar20;
    in_XMM0_Dc = fVar42 * fVar43 + fVar41 * fVar20;
    auVar34._0_4_ = fVar43 * fVar56 + fVar20 * l02.field_0._0_4_;
    auVar34._4_4_ = fVar43 * fVar25 + fVar20 * l02.field_0._4_4_;
    auVar34._8_4_ = fVar43 * fVar29 + fVar20 * l02.field_0._8_4_;
    goto LAB_00ae1e0d;
  }
  fVar64 = fVar20;
  if (iVar7 < 0x9244) {
    if (iVar7 == 0x9134) {
      lVar18 = *plVar9;
      lVar15 = plVar9[2] * uVar17;
      fVar42 = *(float *)(lVar18 + 0x10 + lVar15);
      fVar64 = *(float *)(lVar18 + lVar15);
      in_XMM12_Da = *(float *)(lVar18 + 4 + lVar15);
      fVar69 = *(float *)(lVar18 + 8 + lVar15);
      fVar24 = *(float *)(lVar18 + 0xc + lVar15);
      fVar43 = *(float *)(lVar18 + 0x20 + lVar15);
      in_XMM12_Db = *(float *)(lVar18 + 0x14 + lVar15);
      in_XMM12_Dc = *(float *)(lVar18 + 0x24 + lVar15);
      fVar48 = *(float *)(lVar18 + 0x18 + lVar15);
      fVar51 = *(float *)(lVar18 + 0x28 + lVar15);
      fVar37 = *(float *)(lVar18 + 0x1c + lVar15);
      fVar52 = *(float *)(lVar18 + 0x2c + lVar15);
    }
    else {
      fVar42 = fStack_234;
      fVar43 = fStack_230;
      fVar65 = fStack_22c;
      fVar52 = fVar40;
      if (iVar7 != 0x9234) goto LAB_00ae30b4;
      lVar18 = *plVar9;
      lVar15 = plVar9[2] * uVar17;
      uVar5 = *(undefined8 *)(lVar18 + 4 + lVar15);
      fVar42 = (float)uVar5;
      fVar43 = (float)((ulong)uVar5 >> 0x20);
      fVar64 = *(float *)(lVar18 + lVar15);
      uVar5 = *(undefined8 *)(lVar18 + 0x10 + lVar15);
      in_XMM12_Db = (float)uVar5;
      in_XMM12_Dc = (float)((ulong)uVar5 >> 0x20);
      in_XMM12_Da = *(float *)(lVar18 + 0xc + lVar15);
      uVar5 = *(undefined8 *)(lVar18 + 0x1c + lVar15);
      fVar48 = (float)uVar5;
      fVar51 = (float)((ulong)uVar5 >> 0x20);
      fVar69 = *(float *)(lVar18 + 0x18 + lVar15);
      uVar5 = *(undefined8 *)(lVar18 + 0x28 + lVar15);
      fVar37 = (float)uVar5;
      fVar52 = (float)((ulong)uVar5 >> 0x20);
      fVar24 = *(float *)(lVar18 + 0x24 + lVar15);
    }
    in_XMM12_Dd = 0.0;
    fVar65 = 0.0;
    fVar33 = 0.0;
    local_1e8 = CONCAT44(fVar37,fVar24);
    uStack_1e0 = (ulong)(uint)fVar52;
  }
  else if (iVar7 == 0xb001) {
    lVar18 = *plVar9;
    lVar15 = plVar9[2] * uVar17;
    uVar5 = *(undefined8 *)(lVar18 + 0x10 + lVar15);
    fVar69 = (float)uVar5;
    fVar48 = (float)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)(lVar18 + 0x34 + lVar15);
    fVar42 = (float)uVar5;
    fVar43 = (float)((ulong)uVar5 >> 0x20);
    fVar64 = *(float *)(lVar18 + lVar15);
    in_XMM12_Db = *(float *)(lVar18 + 4 + lVar15);
    fVar51 = *(float *)(lVar18 + 8 + lVar15);
    in_XMM12_Da = *(float *)(lVar18 + 0xc + lVar15);
    fVar56 = *(float *)(lVar18 + 0x18 + lVar15);
    pfVar1 = (float *)(lVar18 + 0x1c + lVar15);
    fVar25 = *pfVar1;
    fVar29 = pfVar1[1];
    fVar52 = 0.0;
    fVar70 = *(float *)(lVar18 + 0x24 + lVar15);
    fVar65 = *(float *)(lVar18 + 0x28 + lVar15);
    in_XMM12_Dd = *(float *)(lVar18 + 0x2c + lVar15);
    fVar24 = *(float *)(lVar18 + 0x30 + lVar15);
    auVar44._0_4_ = fVar24 * fVar24 + in_XMM12_Dd * in_XMM12_Dd + fVar70 * fVar70 + fVar65 * fVar65;
    auVar39 = rsqrtss(ZEXT416((uint)auVar44._0_4_),ZEXT416((uint)auVar44._0_4_));
    fVar36 = auVar39._0_4_;
    fVar33 = fVar36 * fVar36 * auVar44._0_4_ * -0.5 * fVar36 + fVar36 * 1.5;
    fVar70 = fVar70 * fVar33;
    fVar65 = fVar65 * fVar33;
    in_XMM12_Dd = in_XMM12_Dd * fVar33;
    fVar33 = fVar33 * fVar24;
    in_XMM12_Dc = *(float *)(lVar18 + 0x3c + lVar15);
    local_1e8 = CONCAT44(fVar25,fVar56);
    uStack_1e0 = CONCAT44(fVar70,fVar29);
    fVar24 = fVar25;
    fVar37 = fVar29;
  }
  else {
    fVar37 = 0.0;
    if (iVar7 == 0x9244) {
      lVar18 = *plVar9;
      lVar15 = plVar9[2] * uVar17;
      pfVar1 = (float *)(lVar18 + lVar15);
      fVar64 = *pfVar1;
      fVar42 = pfVar1[1];
      fVar43 = pfVar1[2];
      fVar65 = pfVar1[3];
      pfVar1 = (float *)(lVar18 + 0x10 + lVar15);
      in_XMM12_Da = *pfVar1;
      in_XMM12_Db = pfVar1[1];
      in_XMM12_Dc = pfVar1[2];
      in_XMM12_Dd = pfVar1[3];
      pfVar1 = (float *)(lVar18 + 0x20 + lVar15);
      fVar69 = *pfVar1;
      fVar48 = pfVar1[1];
      fVar51 = pfVar1[2];
      fVar33 = pfVar1[3];
      puVar4 = (undefined8 *)(lVar18 + 0x30 + lVar15);
      local_1e8 = *puVar4;
      uStack_1e0 = puVar4[1];
    }
  }
LAB_00ae30b4:
  fVar36 = 0.0;
  lVar18 = (ulong)(uVar14 + 1) * 0x38;
  plVar9 = (long *)(lVar10 + lVar18);
  iVar7 = *(int *)(lVar10 + 0x20 + lVar18);
  if (iVar7 < 0x9244) {
    if (iVar7 == 0x9134) {
      lVar10 = *plVar9;
      lVar18 = uVar17 * plVar9[2];
      auVar71._4_4_ = *(undefined4 *)(lVar10 + 0x10 + lVar18);
      auVar71._0_4_ = *(undefined4 *)(lVar10 + lVar18);
      fVar57 = *(float *)(lVar10 + 4 + lVar18);
      fVar56 = *(float *)(lVar10 + 8 + lVar18);
      fVar24 = *(float *)(lVar10 + 0xc + lVar18);
      auVar71._8_4_ = *(undefined4 *)(lVar10 + 0x20 + lVar18);
      auVar71._12_4_ = 0;
      fVar59 = *(float *)(lVar10 + 0x14 + lVar18);
      fVar60 = *(float *)(lVar10 + 0x24 + lVar18);
      fVar31 = 0.0;
      fVar25 = *(float *)(lVar10 + 0x18 + lVar18);
      fVar29 = *(float *)(lVar10 + 0x28 + lVar18);
      fVar70 = 0.0;
      fVar37 = *(float *)(lVar10 + 0x1c + lVar18);
      fVar52 = *(float *)(lVar10 + 0x2c + lVar18);
      fVar36 = 0.0;
    }
    else if (iVar7 == 0x9234) {
      lVar10 = *plVar9;
      lVar18 = uVar17 * plVar9[2];
      uVar5 = *(undefined8 *)(lVar10 + 4 + lVar18);
      auVar71._4_4_ = (int)uVar5;
      auVar71._0_4_ = *(undefined4 *)(lVar10 + lVar18);
      auVar71._8_4_ = (int)((ulong)uVar5 >> 0x20);
      auVar71._12_4_ = 0;
      uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
      fVar59 = (float)uVar5;
      fVar60 = (float)((ulong)uVar5 >> 0x20);
      fVar57 = *(float *)(lVar10 + 0xc + lVar18);
      fVar31 = 0.0;
      uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
      fVar25 = (float)uVar5;
      fVar29 = (float)((ulong)uVar5 >> 0x20);
      fVar56 = *(float *)(lVar10 + 0x18 + lVar18);
      fVar70 = 0.0;
      uVar5 = *(undefined8 *)(lVar10 + 0x28 + lVar18);
      fVar37 = (float)uVar5;
      fVar52 = (float)((ulong)uVar5 >> 0x20);
      fVar24 = *(float *)(lVar10 + 0x24 + lVar18);
      fVar36 = 0.0;
    }
  }
  else if (iVar7 == 0xb001) {
    lVar10 = *plVar9;
    lVar18 = uVar17 * plVar9[2];
    uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar18);
    fVar56 = (float)uVar5;
    fVar25 = (float)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar18);
    fVar59 = *(float *)(lVar10 + 4 + lVar18);
    fVar29 = *(float *)(lVar10 + 8 + lVar18);
    fVar57 = *(float *)(lVar10 + 0xc + lVar18);
    fVar24 = *(float *)(lVar10 + 0x18 + lVar18);
    uVar6 = *(undefined8 *)(lVar10 + 0x1c + lVar18);
    fVar37 = (float)uVar6;
    fVar52 = (float)((ulong)uVar6 >> 0x20);
    fVar36 = *(float *)(lVar10 + 0x24 + lVar18);
    auVar44._0_4_ = *(float *)(lVar10 + 0x28 + lVar18);
    fVar31 = *(float *)(lVar10 + 0x2c + lVar18);
    fVar70 = *(float *)(lVar10 + 0x30 + lVar18);
    fVar60 = fVar70 * fVar70 + fVar31 * fVar31 + fVar36 * fVar36 + auVar44._0_4_ * auVar44._0_4_;
    auVar39 = rsqrtss(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
    fVar41 = auVar39._0_4_;
    fVar41 = fVar41 * fVar41 * fVar60 * -0.5 * fVar41 + fVar41 * 1.5;
    fVar36 = fVar36 * fVar41;
    fVar31 = fVar31 * fVar41;
    fVar70 = fVar41 * fVar70;
    auVar71._4_4_ = (int)uVar5;
    auVar71._0_4_ = *(undefined4 *)(lVar10 + lVar18);
    auVar71._8_4_ = (int)((ulong)uVar5 >> 0x20);
    auVar71._12_4_ = auVar44._0_4_ * fVar41;
    fVar60 = *(float *)(lVar10 + 0x3c + lVar18);
  }
  else if (iVar7 == 0x9244) {
    lVar10 = *plVar9;
    lVar18 = uVar17 * plVar9[2];
    auVar71 = *(undefined1 (*) [16])(lVar10 + lVar18);
    pfVar1 = (float *)(lVar10 + 0x10 + lVar18);
    fVar57 = *pfVar1;
    fVar59 = pfVar1[1];
    fVar60 = pfVar1[2];
    fVar31 = pfVar1[3];
    pfVar1 = (float *)(lVar10 + 0x20 + lVar18);
    fVar56 = *pfVar1;
    fVar25 = pfVar1[1];
    fVar29 = pfVar1[2];
    fVar70 = pfVar1[3];
    pfVar1 = (float *)(lVar10 + 0x30 + lVar18);
    fVar24 = *pfVar1;
    fVar37 = pfVar1[1];
    fVar52 = pfVar1[2];
    fVar36 = pfVar1[3];
  }
  fVar40 = auVar71._12_4_;
  fVar41 = fVar33 * fVar70 + in_XMM12_Dd * fVar31 + fVar36 * uStack_1e0._4_4_ + fVar65 * fVar40;
  auVar44._0_4_ = -fVar41;
  if (fVar41 < auVar44._0_4_) {
    fVar31 = -fVar31;
  }
  fVar32 = ABS(fVar41);
  fVar35 = auVar44._0_4_;
  if (auVar44._0_4_ <= fVar41) {
    fVar35 = fVar41;
  }
  fVar22 = 1.0 - fVar32;
  if (fVar22 < 0.0) {
    local_c8 = fVar32;
    fStack_c4 = ABS(fVar33);
    fStack_c0 = ABS(fVar33);
    fStack_bc = ABS(fVar33);
    local_b8 = fVar41;
    fStack_b4 = fVar33;
    fStack_b0 = fVar33;
    fStack_ac = fVar33;
    fVar22 = sqrtf(fVar22);
    fVar23 = local_c8;
    fVar50 = local_b8;
  }
  else {
    fVar22 = SQRT(fVar22);
    fVar23 = fVar32;
    fVar50 = fVar41;
  }
  fVar22 = 1.5707964 -
           fVar22 * (((((fVar32 * -0.0043095737 + 0.0192803) * fVar32 + -0.04489909) * fVar32 +
                      0.08785567) * fVar32 + -0.21450998) * fVar32 + 1.5707952);
  fVar32 = 0.0;
  if (0.0 <= fVar22) {
    fVar32 = fVar22;
  }
  fVar30 = (float)(-(uint)(1.0 < fVar23) & 0x7fc00000 |
                  ~-(uint)(1.0 < fVar23) &
                  (uint)(1.5707964 -
                        (float)((uint)-fVar32 & -(uint)(fVar35 < 0.0) |
                               ~-(uint)(fVar35 < 0.0) & (uint)fVar32))) * fVar20;
  fVar23 = floorf(fVar30 * 0.63661975);
  fVar30 = fVar30 - fVar23 * 1.5707964;
  fVar32 = fVar30 * fVar30;
  uVar14 = (int)fVar23 & 3;
  fVar22 = ((((fVar32 * -2.5963018e-07 + 2.4756235e-05) * fVar32 + -0.001388833) * fVar32 +
            0.04166664) * fVar32 + -0.5) * fVar32 + 1.0;
  fVar30 = (((((fVar32 * -2.5029328e-08 + 2.7600126e-06) * fVar32 + -0.00019842605) * fVar32 +
             0.008333348) * fVar32 + -0.16666667) * fVar32 + 1.0) * fVar30;
  fVar32 = fVar30;
  if (((int)fVar23 & 1U) != 0) {
    fVar32 = fVar22;
    fVar22 = fVar30;
  }
  auVar44._0_4_ =
       (float)(~-(uint)(fVar41 < auVar44._0_4_) & (uint)fVar70 |
              (uint)-fVar70 & -(uint)(fVar41 < auVar44._0_4_));
  if (1 < uVar14) {
    fVar32 = -fVar32;
  }
  if (uVar14 - 1 < 2) {
    fVar22 = -fVar22;
  }
  fVar70 = fVar35 * in_XMM12_Dd - fVar31;
  fVar66 = fVar35 * fVar33 - auVar44._0_4_;
  fVar41 = 1.0 - fVar20;
  fVar31 = fVar41 * in_XMM12_Dd + fVar31 * fVar20;
  auVar44._0_4_ = fVar41 * fVar33 + auVar44._0_4_ * fVar20;
  uVar14 = (int)((uint)(fVar50 < 0.0) << 0x1f) >> 0x1f;
  uVar49 = (int)((uint)(fVar50 < 0.0) << 0x1f) >> 0x1f;
  fVar50 = (float)((uint)-fVar36 & uVar14 | ~uVar14 & (uint)fVar36);
  fVar58 = (float)((uint)-fVar40 & uVar49 | ~uVar49 & (uint)fVar40);
  fVar36 = fVar35 * uStack_1e0._4_4_ - fVar50;
  fVar40 = fVar35 * fVar65 - fVar58;
  auVar62._0_8_ = CONCAT44(fVar33,fVar66) ^ 0x8000000000000000;
  auVar62._8_4_ = -fVar33;
  auVar62._12_4_ = -fVar33;
  auVar63._4_12_ = auVar62._4_12_;
  auVar63._0_4_ = fVar66 * fVar66 + fVar70 * fVar70 + fVar36 * fVar36 + fVar40 * fVar40;
  auVar55._0_8_ = CONCAT44(fVar33,auVar63._0_4_) ^ 0x8000000000000000;
  auVar55._8_4_ = -fVar33;
  auVar55._12_4_ = -fVar33;
  auVar39 = rsqrtss(auVar55,auVar63);
  fVar23 = auVar39._0_4_;
  fVar30 = fVar23 * fVar23 * auVar63._0_4_ * -0.5 * fVar23 + fVar23 * 1.5;
  fVar23 = uStack_1e0._4_4_ * fVar41 + fVar50 * fVar20;
  fVar50 = fVar65 * fVar41 + fVar58 * fVar20;
  fVar67 = auVar44._0_4_ * auVar44._0_4_ + fVar31 * fVar31 + fVar23 * fVar23 + fVar50 * fVar50;
  auVar39 = rsqrtss(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
  fVar58 = auVar39._0_4_;
  fVar58 = fVar58 * fVar58 * fVar67 * -0.5 * fVar58 + fVar58 * 1.5;
  uVar14 = (int)((uint)(0.9995 < fVar35) << 0x1f) >> 0x1f;
  uVar49 = (int)((uint)(0.9995 < fVar35) << 0x1f) >> 0x1f;
  fVar36 = (float)(~uVar14 & (uint)(fVar22 * uStack_1e0._4_4_ - fVar32 * fVar30 * fVar36) |
                  (uint)(fVar58 * fVar23) & uVar14);
  fVar65 = (float)(~uVar49 & (uint)(fVar22 * fVar65 - fVar32 * fVar30 * fVar40) |
                  (uint)(fVar58 * fVar50) & uVar49);
  if (0.9995 < fVar35) {
    fVar31 = fVar31 * fVar58;
    auVar44._0_4_ = auVar44._0_4_ * fVar58;
  }
  else {
    fVar31 = in_XMM12_Dd * fVar22 - fVar70 * fVar30 * fVar32;
    auVar44._0_4_ = fVar33 * fVar22 - fVar66 * fVar30 * fVar32;
  }
  local_198._0_4_ = auVar71._0_4_;
  local_198._4_4_ = auVar71._4_4_;
  fStack_190 = auVar71._8_4_;
  fVar33 = fVar64 * fVar41 + (float)local_198 * fVar20;
  fVar70 = in_XMM12_Dc * fVar41;
  fVar57 = in_XMM12_Da * fVar41 + fVar57 * fVar20;
  fVar59 = in_XMM12_Db * fVar41 + fVar59 * fVar20;
  fVar40 = fVar69 * fVar41 + fVar56 * fVar20;
  fVar35 = fVar48 * fVar41 + fVar25 * fVar20;
  fVar29 = fVar51 * fVar41 + fVar29 * fVar20;
  fVar69 = (float)local_1e8 * fVar41 + fVar24 * fVar20;
  fVar48 = local_1e8._4_4_ * fVar41 + fVar37 * fVar20;
  fVar51 = (float)uStack_1e0 * fVar41 + fVar52 * fVar20;
  fVar25 = fVar65 * fVar31 + fVar36 * auVar44._0_4_;
  fVar37 = fVar65 * fVar31 - fVar36 * auVar44._0_4_;
  fVar56 = fVar36 * fVar36 + fVar65 * fVar65 + -fVar31 * fVar31 + -auVar44._0_4_ * auVar44._0_4_;
  fVar24 = fVar36 * fVar36 - fVar65 * fVar65;
  fVar32 = fVar31 * fVar31 + fVar24 + -auVar44._0_4_ * auVar44._0_4_;
  fVar23 = fVar65 * auVar44._0_4_ - fVar36 * fVar31;
  fVar52 = fVar36 * fVar31 + fVar65 * auVar44._0_4_;
  fVar22 = fVar31 * auVar44._0_4_ + fVar36 * fVar65;
  fVar64 = fVar31 * auVar44._0_4_ - fVar36 * fVar65;
  fVar25 = fVar25 + fVar25;
  fVar23 = fVar23 + fVar23;
  fVar24 = auVar44._0_4_ * auVar44._0_4_ + fVar24 + -fVar31 * fVar31;
  fVar36 = fVar56 * 1.0 + fVar25 * 0.0 + fVar23 * 0.0;
  auVar44._0_4_ = fVar56 * 0.0 + fVar25 * 1.0 + fVar23 * 0.0;
  fVar65 = fVar56 * 0.0 + fVar25 * 0.0 + fVar23 * 1.0;
  fVar22 = fVar22 + fVar22;
  fVar37 = fVar37 + fVar37;
  fVar56 = fVar37 * 1.0 + fVar32 * 0.0 + fVar22 * 0.0;
  fVar25 = fVar37 * 0.0 + fVar32 * 1.0 + fVar22 * 0.0;
  fVar31 = fVar37 * 0.0 + fVar32 * 0.0 + fVar22 * 1.0;
  fVar52 = fVar52 + fVar52;
  fVar64 = fVar64 + fVar64;
  fVar37 = fVar52 * 1.0 + fVar64 * 0.0 + fVar24 * 0.0;
  fVar32 = fVar52 * 0.0 + fVar64 * 1.0 + fVar24 * 0.0;
  fVar24 = fVar52 * 0.0 + fVar64 * 0.0 + fVar24 * 1.0;
  in_XMM12_Da = fVar33 * fVar36 + fVar56 * 0.0 + fVar37 * 0.0;
  in_XMM12_Db = fVar33 * auVar44._0_4_ + fVar25 * 0.0 + fVar32 * 0.0;
  in_XMM12_Dc = fVar33 * fVar65 + fVar31 * 0.0 + fVar24 * 0.0;
  a0.field_0._0_4_ = fVar57 * fVar36 + fVar59 * fVar56 + fVar37 * 0.0;
  a0.field_0._4_4_ = fVar57 * auVar44._0_4_ + fVar59 * fVar25 + fVar32 * 0.0;
  a0.field_0._8_4_ = fVar57 * fVar65 + fVar59 * fVar31 + fVar24 * 0.0;
  in_XMM0_Da = fVar40 * fVar36 + fVar35 * fVar56 + fVar29 * fVar37;
  in_XMM0_Db = fVar40 * auVar44._0_4_ + fVar35 * fVar25 + fVar29 * fVar32;
  in_XMM0_Dc = fVar40 * fVar65 + fVar35 * fVar31 + fVar29 * fVar24;
  auVar34._0_4_ =
       fVar69 * fVar36 + fVar48 * fVar56 + fVar51 * fVar37 +
       fVar42 * fVar41 + local_198._4_4_ * fVar20 + 0.0;
  auVar34._4_4_ =
       fVar69 * auVar44._0_4_ + fVar48 * fVar25 + fVar51 * fVar32 +
       fVar43 * fVar41 + fStack_190 * fVar20 + 0.0;
  auVar34._8_4_ =
       fVar69 * fVar65 + fVar48 * fVar31 + fVar51 * fVar24 + fVar70 + fVar60 * fVar20 + 0.0;
LAB_00ae1e0d:
  fVar24 = a0.field_0._0_4_;
  fVar64 = a0.field_0._4_4_;
  fVar36 = a0.field_0._8_4_;
  auVar38._0_4_ = fVar24 * in_XMM0_Db - in_XMM0_Da * fVar64;
  auVar44._0_4_ = fVar64 * in_XMM0_Dc - in_XMM0_Db * fVar36;
  fVar41 = fVar36 * in_XMM0_Da - in_XMM0_Dc * fVar24;
  auVar38._4_4_ = in_XMM0_Da * in_XMM12_Db - in_XMM0_Db * in_XMM12_Da;
  auVar38._8_4_ = fVar64 * in_XMM12_Da - in_XMM12_Db * fVar24;
  auVar38._12_4_ = 0;
  auVar53._4_4_ = in_XMM0_Db * in_XMM12_Dc - in_XMM0_Dc * in_XMM12_Db;
  auVar53._0_4_ = auVar44._0_4_;
  auVar53._8_4_ = fVar36 * in_XMM12_Db - in_XMM12_Dc * fVar64;
  auVar53._12_4_ = 0;
  auVar46._4_4_ = in_XMM0_Dc * in_XMM12_Da - in_XMM0_Da * in_XMM12_Dc;
  auVar46._0_4_ = fVar41;
  auVar46._8_4_ = fVar24 * in_XMM12_Dc - in_XMM12_Da * fVar36;
  auVar46._12_4_ = 0;
  auVar68._0_4_ = in_XMM12_Dc * auVar38._0_4_ + in_XMM12_Db * fVar41 + in_XMM12_Da * auVar44._0_4_;
  auVar68._4_4_ = auVar68._0_4_;
  auVar68._8_4_ = auVar68._0_4_;
  auVar68._12_4_ = auVar68._0_4_;
  auVar54 = divps(auVar53,auVar68);
  auVar47 = divps(auVar46,auVar68);
  auVar39 = divps(auVar38,auVar68);
  fVar24 = auVar34._0_4_;
  fVar64 = auVar34._4_4_;
  fVar36 = auVar34._8_4_;
  auVar44._0_4_ = auVar39._0_4_;
  fVar41 = auVar39._4_4_;
  fVar69 = auVar39._8_4_;
  fVar42 = auVar47._0_4_;
  fVar43 = auVar47._4_4_;
  fVar48 = auVar47._8_4_;
  fVar51 = auVar54._0_4_;
  fVar65 = auVar54._4_4_;
  fVar57 = auVar54._8_4_;
  fVar56 = fVar24 * fVar51 + fVar64 * fVar42 + fVar36 * auVar44._0_4_;
  fVar59 = fVar24 * fVar65 + fVar64 * fVar43 + fVar36 * fVar41;
  fVar60 = fVar24 * fVar57 + fVar64 * fVar48 + fVar36 * fVar69;
  local_198._0_4_ = -fVar56;
  local_198._4_4_ = -fVar59;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_78 = 0.0;
    if (((1e-05 < ABS(fVar57 * fVar48 + fVar65 * fVar43 + fVar51 * fVar42)) ||
        (1e-05 < ABS(fVar57 * fVar69 + fVar65 * fVar41 + fVar51 * auVar44._0_4_))) ||
       (1e-05 < ABS(fVar48 * fVar69 + fVar43 * fVar41 + fVar42 * auVar44._0_4_))) {
      bVar16 = false;
    }
    else {
      fVar25 = fVar57 * fVar57 + fVar65 * fVar65 + fVar51 * fVar51;
      fVar29 = fVar43 * fVar43 + fVar42 * fVar42 + fVar48 * fVar48;
      bVar16 = false;
      if (((ABS(fVar25 - fVar29) <= 1e-05) &&
          (fVar31 = fVar41 * fVar41 + auVar44._0_4_ * auVar44._0_4_ + fVar69 * fVar69,
          bVar16 = false, ABS(fVar25 - fVar31) <= 1e-05)) &&
         (fVar29 = ABS(fVar29 - fVar31), bVar16 = fVar29 <= 1e-05, fVar29 <= 1e-05)) {
        bVar16 = true;
        if (fVar25 < 0.0) {
          local_198 = CONCAT44(fVar59,fVar56) ^ 0x8000000080000000;
          local_78 = sqrtf(fVar25);
        }
        else {
          local_78 = SQRT(fVar25);
        }
      }
    }
    local_90 = 2 - (uint)bVar16;
  }
  else {
    local_90 = 2;
    local_78 = 0.0;
  }
  pRVar11 = context->userContext;
  uVar14 = pRVar11->instStackSize;
  *(ulong *)(pRVar11->instID + uVar14) = CONCAT44((*prim).primID_,(*prim).instID_);
  *(undefined1 (*) [16])pRVar11->world2inst[uVar14] = auVar54;
  *(undefined1 (*) [16])(pRVar11->world2inst[uVar14] + 4) = auVar47;
  *(undefined1 (*) [16])(pRVar11->world2inst[uVar14] + 8) = auVar39;
  pfVar1 = pRVar11->world2inst[uVar14] + 0xc;
  *pfVar1 = (float)local_198;
  pfVar1[1] = local_198._4_4_;
  pfVar1[2] = -fVar60;
  pfVar1[3] = -(fVar24 * auVar54._12_4_ + fVar64 * auVar47._12_4_ + fVar36 * auVar39._12_4_);
  pafVar3 = pRVar11->inst2world + uVar14;
  (*pafVar3)[0] = in_XMM11_Da;
  (*pafVar3)[1] = in_XMM11_Db;
  (*pafVar3)[2] = in_XMM11_Dc;
  (*pafVar3)[3] = in_XMM11_Dd;
  *(undefined1 (*) [16])(pRVar11->inst2world[uVar14] + 4) = in_XMM14;
  pfVar1 = pRVar11->inst2world[uVar14] + 8;
  *pfVar1 = in_XMM13_Da;
  pfVar1[1] = in_XMM13_Db;
  pfVar1[2] = fVar21;
  pfVar1[3] = in_XMM13_Dd;
  pfVar1 = pRVar11->inst2world[uVar14] + 0xc;
  *pfVar1 = in_XMM15_Da;
  pfVar1[1] = in_XMM15_Db;
  pfVar1[2] = in_XMM15_Dc;
  pfVar1[3] = in_XMM15_Dd;
  pRVar11->instStackSize = pRVar11->instStackSize + 1;
  local_dc = query->time;
  fVar21 = (query->p).field_0.field_0.x;
  fVar24 = (query->p).field_0.field_0.y;
  fVar64 = (query->p).field_0.field_0.z;
  local_e8 = CONCAT44(fVar21 * fVar65 + fVar24 * fVar43 + (fVar64 * fVar41 - fVar59),
                      fVar21 * fVar51 + fVar24 * fVar42 + (fVar64 * auVar44._0_4_ - fVar56));
  local_e0 = fVar21 * fVar57 + fVar24 * fVar48 + (fVar64 * fVar69 - fVar60);
  local_d8 = query->radius * local_78;
  local_98 = context->query_ws;
  local_88 = context->func;
  local_80 = context->userContext;
  local_70 = context->userPtr;
  local_a0 = 0;
  local_68 = 0xffffffffffffffff;
  local_58 = local_98->radius;
  fVar21 = local_98->radius;
  local_a8 = p_Var19;
  if (local_90 == 2) {
    fStack_54 = fVar21;
    fStack_50 = fVar21;
    fStack_4c = fVar21;
    if ((fVar21 < INFINITY) && (local_80->instStackSize != 0)) {
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      pointQuery();
      fVar21 = local_48;
      fStack_54 = fStack_44;
      fStack_50 = fStack_40;
      fStack_4c = fStack_3c;
    }
  }
  else {
    fVar21 = local_78 * fVar21;
    fStack_54 = fVar21;
    fStack_50 = fVar21;
    fStack_4c = fVar21;
  }
  local_58 = fVar21;
  uVar12 = (**(code **)(p_Var19 + 0x88))(p_Var19 + 0x58,&local_e8);
  pRVar11 = context->userContext;
  uVar14 = pRVar11->instStackSize - 1;
  pRVar11->instStackSize = uVar14;
  pRVar11->instID[uVar14] = 0xffffffff;
  pRVar11->instPrimID[pRVar11->instStackSize] = 0xffffffff;
  return (bool)uVar12;
}

Assistant:

bool InstanceArrayIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_, query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }